

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  uint uVar11;
  int iVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  float fVar72;
  float fVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [28];
  uint uVar87;
  uint uVar88;
  ulong uVar89;
  uint uVar90;
  ulong uVar91;
  ulong uVar92;
  long lVar93;
  undefined4 uVar94;
  undefined8 uVar95;
  float fVar117;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar96 [16];
  float fVar115;
  float fVar119;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar100 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar127 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 extraout_var [56];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar148 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  vint4 ai_1;
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined4 uVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [64];
  float fVar220;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  float fVar227;
  float fVar232;
  float fVar233;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar231 [64];
  float fVar238;
  float fVar239;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_8a0 [32];
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_800 [16];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 (*local_668) [16];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  int iStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2c0 [32];
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint local_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar204 [16];
  
  PVar10 = prim[1];
  uVar92 = (ulong)(byte)PVar10;
  fVar146 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar205 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar205 = vsubps_avx(auVar205,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  auVar96._0_4_ = fVar146 * auVar205._0_4_;
  auVar96._4_4_ = fVar146 * auVar205._4_4_;
  auVar96._8_4_ = fVar146 * auVar205._8_4_;
  auVar96._12_4_ = fVar146 * auVar205._12_4_;
  auVar177._0_4_ = fVar146 * auVar15._0_4_;
  auVar177._4_4_ = fVar146 * auVar15._4_4_;
  auVar177._8_4_ = fVar146 * auVar15._8_4_;
  auVar177._12_4_ = fVar146 * auVar15._12_4_;
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xb + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar92 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar89 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar92 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar89 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar228._4_4_ = auVar177._0_4_;
  auVar228._0_4_ = auVar177._0_4_;
  auVar228._8_4_ = auVar177._0_4_;
  auVar228._12_4_ = auVar177._0_4_;
  auVar125 = vshufps_avx(auVar177,auVar177,0x55);
  auVar97 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar146 = auVar97._0_4_;
  auVar217._0_4_ = fVar146 * auVar16._0_4_;
  fVar115 = auVar97._4_4_;
  auVar217._4_4_ = fVar115 * auVar16._4_4_;
  fVar117 = auVar97._8_4_;
  auVar217._8_4_ = fVar117 * auVar16._8_4_;
  fVar119 = auVar97._12_4_;
  auVar217._12_4_ = fVar119 * auVar16._12_4_;
  auVar211._0_4_ = auVar17._0_4_ * fVar146;
  auVar211._4_4_ = auVar17._4_4_ * fVar115;
  auVar211._8_4_ = auVar17._8_4_ * fVar117;
  auVar211._12_4_ = auVar17._12_4_ * fVar119;
  auVar199._0_4_ = auVar147._0_4_ * fVar146;
  auVar199._4_4_ = auVar147._4_4_ * fVar115;
  auVar199._8_4_ = auVar147._8_4_ * fVar117;
  auVar199._12_4_ = auVar147._12_4_ * fVar119;
  auVar97 = vfmadd231ps_fma(auVar217,auVar125,auVar15);
  auVar126 = vfmadd231ps_fma(auVar211,auVar125,auVar101);
  auVar125 = vfmadd231ps_fma(auVar199,auVar98,auVar125);
  auVar161 = vfmadd231ps_fma(auVar97,auVar228,auVar205);
  auVar126 = vfmadd231ps_fma(auVar126,auVar228,auVar102);
  auVar215 = ZEXT1664(auVar126);
  auVar169 = vfmadd231ps_fma(auVar125,auVar99,auVar228);
  auVar229._4_4_ = auVar96._0_4_;
  auVar229._0_4_ = auVar96._0_4_;
  auVar229._8_4_ = auVar96._0_4_;
  auVar229._12_4_ = auVar96._0_4_;
  auVar125 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar146 = auVar97._0_4_;
  auVar178._0_4_ = fVar146 * auVar16._0_4_;
  fVar115 = auVar97._4_4_;
  auVar178._4_4_ = fVar115 * auVar16._4_4_;
  fVar117 = auVar97._8_4_;
  auVar178._8_4_ = fVar117 * auVar16._8_4_;
  fVar119 = auVar97._12_4_;
  auVar178._12_4_ = fVar119 * auVar16._12_4_;
  auVar124._0_4_ = auVar17._0_4_ * fVar146;
  auVar124._4_4_ = auVar17._4_4_ * fVar115;
  auVar124._8_4_ = auVar17._8_4_ * fVar117;
  auVar124._12_4_ = auVar17._12_4_ * fVar119;
  auVar97._0_4_ = auVar147._0_4_ * fVar146;
  auVar97._4_4_ = auVar147._4_4_ * fVar115;
  auVar97._8_4_ = auVar147._8_4_ * fVar117;
  auVar97._12_4_ = auVar147._12_4_ * fVar119;
  auVar15 = vfmadd231ps_fma(auVar178,auVar125,auVar15);
  auVar16 = vfmadd231ps_fma(auVar124,auVar125,auVar101);
  auVar101 = vfmadd231ps_fma(auVar97,auVar125,auVar98);
  auVar17 = vfmadd231ps_fma(auVar15,auVar229,auVar205);
  auVar98 = vfmadd231ps_fma(auVar16,auVar229,auVar102);
  auVar147 = vfmadd231ps_fma(auVar101,auVar229,auVar99);
  local_1b0._8_4_ = 0x7fffffff;
  local_1b0._0_8_ = 0x7fffffff7fffffff;
  local_1b0._12_4_ = 0x7fffffff;
  auVar205 = vandps_avx(auVar161,local_1b0);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar205 = vcmpps_avx(auVar205,auVar168,1);
  auVar15 = vblendvps_avx(auVar161,auVar168,auVar205);
  auVar205 = vandps_avx(auVar126,local_1b0);
  auVar205 = vcmpps_avx(auVar205,auVar168,1);
  auVar16 = vblendvps_avx(auVar126,auVar168,auVar205);
  auVar205 = vandps_avx(auVar169,local_1b0);
  auVar205 = vcmpps_avx(auVar205,auVar168,1);
  auVar205 = vblendvps_avx(auVar169,auVar168,auVar205);
  auVar102 = vrcpps_avx(auVar15);
  auVar194._8_4_ = 0x3f800000;
  auVar194._0_8_ = &DAT_3f8000003f800000;
  auVar194._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar102,auVar194);
  auVar102 = vfmadd132ps_fma(auVar15,auVar102,auVar102);
  auVar15 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar15,auVar194);
  auVar101 = vfmadd132ps_fma(auVar16,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar205);
  auVar205 = vfnmadd213ps_fma(auVar205,auVar15,auVar194);
  auVar99 = vfmadd132ps_fma(auVar205,auVar15,auVar15);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar205 = vpmovsxwd_avx(auVar205);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar205 = vsubps_avx(auVar205,auVar17);
  auVar169._0_4_ = auVar102._0_4_ * auVar205._0_4_;
  auVar169._4_4_ = auVar102._4_4_ * auVar205._4_4_;
  auVar169._8_4_ = auVar102._8_4_ * auVar205._8_4_;
  auVar169._12_4_ = auVar102._12_4_ * auVar205._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar205 = vpmovsxwd_avx(auVar15);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar205 = vsubps_avx(auVar205,auVar17);
  auVar179._0_4_ = auVar102._0_4_ * auVar205._0_4_;
  auVar179._4_4_ = auVar102._4_4_ * auVar205._4_4_;
  auVar179._8_4_ = auVar102._8_4_ * auVar205._8_4_;
  auVar179._12_4_ = auVar102._12_4_ * auVar205._12_4_;
  auVar126._1_3_ = 0;
  auVar126[0] = PVar10;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar15 = vpmovsxwd_avx(auVar16);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar92 * -2 + 6);
  auVar205 = vpmovsxwd_avx(auVar102);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar205 = vsubps_avx(auVar205,auVar98);
  auVar200._0_4_ = auVar205._0_4_ * auVar101._0_4_;
  auVar200._4_4_ = auVar205._4_4_ * auVar101._4_4_;
  auVar200._8_4_ = auVar205._8_4_ * auVar101._8_4_;
  auVar200._12_4_ = auVar205._12_4_ * auVar101._12_4_;
  auVar205 = vcvtdq2ps_avx(auVar15);
  auVar205 = vsubps_avx(auVar205,auVar98);
  auVar125._0_4_ = auVar101._0_4_ * auVar205._0_4_;
  auVar125._4_4_ = auVar101._4_4_ * auVar205._4_4_;
  auVar125._8_4_ = auVar101._8_4_ * auVar205._8_4_;
  auVar125._12_4_ = auVar101._12_4_ * auVar205._12_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar89 + uVar92 + 6);
  auVar205 = vpmovsxwd_avx(auVar101);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar205 = vsubps_avx(auVar205,auVar147);
  auVar161._0_4_ = auVar99._0_4_ * auVar205._0_4_;
  auVar161._4_4_ = auVar99._4_4_ * auVar205._4_4_;
  auVar161._8_4_ = auVar99._8_4_ * auVar205._8_4_;
  auVar161._12_4_ = auVar99._12_4_ * auVar205._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar92 * 0x17 + 6);
  auVar205 = vpmovsxwd_avx(auVar17);
  auVar205 = vcvtdq2ps_avx(auVar205);
  auVar205 = vsubps_avx(auVar205,auVar147);
  auVar98._0_4_ = auVar99._0_4_ * auVar205._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar205._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar205._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar205._12_4_;
  auVar205 = vpminsd_avx(auVar169,auVar179);
  auVar15 = vpminsd_avx(auVar200,auVar125);
  auVar205 = vmaxps_avx(auVar205,auVar15);
  auVar15 = vpminsd_avx(auVar161,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar204._4_4_ = uVar94;
  auVar204._0_4_ = uVar94;
  auVar204._8_4_ = uVar94;
  auVar204._12_4_ = uVar94;
  auVar210 = ZEXT1664(auVar204);
  auVar15 = vmaxps_avx(auVar15,auVar204);
  auVar205 = vmaxps_avx(auVar205,auVar15);
  local_1c0._0_4_ = auVar205._0_4_ * 0.99999964;
  local_1c0._4_4_ = auVar205._4_4_ * 0.99999964;
  local_1c0._8_4_ = auVar205._8_4_ * 0.99999964;
  local_1c0._12_4_ = auVar205._12_4_ * 0.99999964;
  auVar205 = vpmaxsd_avx(auVar169,auVar179);
  auVar15 = vpmaxsd_avx(auVar200,auVar125);
  auVar205 = vminps_avx(auVar205,auVar15);
  auVar15 = vpmaxsd_avx(auVar161,auVar98);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar147._4_4_ = uVar94;
  auVar147._0_4_ = uVar94;
  auVar147._8_4_ = uVar94;
  auVar147._12_4_ = uVar94;
  auVar15 = vminps_avx(auVar15,auVar147);
  auVar205 = vminps_avx(auVar205,auVar15);
  auVar99._0_4_ = auVar205._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar205._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar205._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar205._12_4_ * 1.0000004;
  auVar126[4] = PVar10;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar10;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar10;
  auVar126._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar126,_DAT_01ff0cf0);
  auVar205 = vcmpps_avx(local_1c0,auVar99,2);
  auVar205 = vandps_avx(auVar205,auVar15);
  uVar87 = vmovmskps_avx(auVar205);
  if (uVar87 != 0) {
    uVar87 = uVar87 & 0xff;
    local_568 = pre->ray_space + k;
    local_560 = mm_lookupmask_ps._16_8_;
    uStack_558 = mm_lookupmask_ps._24_8_;
    uStack_550 = mm_lookupmask_ps._16_8_;
    uStack_548 = mm_lookupmask_ps._24_8_;
    local_668 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar158 = local_520;
      auVar206 = auVar210._0_32_;
      auVar111 = auVar215._0_32_;
      lVar21 = 0;
      uVar92 = (ulong)uVar87;
      for (uVar89 = uVar92; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar87 = *(uint *)(prim + 2);
      uVar11 = *(uint *)(prim + lVar21 * 4 + 6);
      pGVar13 = (context->scene->geometries).items[uVar87].ptr;
      uVar89 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                               pGVar13[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar11);
      p_Var14 = pGVar13[1].intersectionFilterN;
      lVar21 = *(long *)&pGVar13[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar21 + (long)p_Var14 * uVar89);
      uVar74 = *(undefined8 *)*pauVar1;
      uVar75 = *(undefined8 *)(*pauVar1 + 8);
      auVar16 = *pauVar1;
      auVar15 = *pauVar1;
      auVar205 = *pauVar1;
      pauVar2 = (undefined1 (*) [16])(lVar21 + (uVar89 + 1) * (long)p_Var14);
      local_720 = *(undefined8 *)*pauVar2;
      uStack_718 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar21 + (uVar89 + 2) * (long)p_Var14);
      local_730 = *(undefined8 *)*pauVar3;
      uStack_728 = *(undefined8 *)(*pauVar3 + 8);
      uVar92 = uVar92 - 1 & uVar92;
      pauVar4 = (undefined1 (*) [16])(lVar21 + (uVar89 + 3) * (long)p_Var14);
      local_2e0 = *(undefined8 *)*pauVar4;
      uStack_2d8 = *(undefined8 *)(*pauVar4 + 8);
      local_740 = (float)local_2e0;
      fStack_73c = (float)((ulong)local_2e0 >> 0x20);
      fStack_738 = (float)uStack_2d8;
      fStack_734 = (float)((ulong)uStack_2d8 >> 0x20);
      if (uVar92 != 0) {
        uVar91 = uVar92 - 1 & uVar92;
        for (uVar89 = uVar92; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
        }
        if (uVar91 != 0) {
          for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar99 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar101 = vsubps_avx(*pauVar1,auVar99);
      uVar94 = auVar101._0_4_;
      auVar170._4_4_ = uVar94;
      auVar170._0_4_ = uVar94;
      auVar170._8_4_ = uVar94;
      auVar170._12_4_ = uVar94;
      auVar102 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      aVar7 = (local_568->vx).field_0;
      aVar8 = (local_568->vy).field_0;
      fVar146 = (local_568->vz).field_0.m128[0];
      fVar115 = *(float *)((long)&(local_568->vz).field_0 + 4);
      fVar117 = *(float *)((long)&(local_568->vz).field_0 + 8);
      fVar119 = *(float *)((long)&(local_568->vz).field_0 + 0xc);
      auVar185._0_4_ = fVar146 * auVar101._0_4_;
      auVar185._4_4_ = fVar115 * auVar101._4_4_;
      auVar185._8_4_ = fVar117 * auVar101._8_4_;
      auVar185._12_4_ = fVar119 * auVar101._12_4_;
      auVar102 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar8,auVar102);
      auVar147 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar7,auVar170);
      auVar102 = vblendps_avx(auVar147,*pauVar1,8);
      auVar17 = vsubps_avx(*pauVar2,auVar99);
      uVar94 = auVar17._0_4_;
      auVar186._4_4_ = uVar94;
      auVar186._0_4_ = uVar94;
      auVar186._8_4_ = uVar94;
      auVar186._12_4_ = uVar94;
      auVar101 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar212._0_4_ = fVar146 * auVar17._0_4_;
      auVar212._4_4_ = fVar115 * auVar17._4_4_;
      auVar212._8_4_ = fVar117 * auVar17._8_4_;
      auVar212._12_4_ = fVar119 * auVar17._12_4_;
      auVar101 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar8,auVar101);
      auVar125 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar7,auVar186);
      auVar101 = vblendps_avx(auVar125,*pauVar2,8);
      auVar98 = vsubps_avx(*pauVar3,auVar99);
      uVar94 = auVar98._0_4_;
      auVar195._4_4_ = uVar94;
      auVar195._0_4_ = uVar94;
      auVar195._8_4_ = uVar94;
      auVar195._12_4_ = uVar94;
      auVar17 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar218._0_4_ = fVar146 * auVar98._0_4_;
      auVar218._4_4_ = fVar115 * auVar98._4_4_;
      auVar218._8_4_ = fVar117 * auVar98._8_4_;
      auVar218._12_4_ = fVar119 * auVar98._12_4_;
      auVar17 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar8,auVar17);
      auVar97 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar7,auVar195);
      auVar17 = vblendps_avx(auVar97,*pauVar3,8);
      auVar80._12_4_ = fStack_734;
      auVar80._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar98 = vsubps_avx(auVar80,auVar99);
      uVar94 = auVar98._0_4_;
      auVar196._4_4_ = uVar94;
      auVar196._0_4_ = uVar94;
      auVar196._8_4_ = uVar94;
      auVar196._12_4_ = uVar94;
      auVar99 = vshufps_avx(auVar98,auVar98,0x55);
      auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar221._0_4_ = fVar146 * auVar98._0_4_;
      auVar221._4_4_ = fVar115 * auVar98._4_4_;
      auVar221._8_4_ = fVar117 * auVar98._8_4_;
      auVar221._12_4_ = fVar119 * auVar98._12_4_;
      auVar99 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar8,auVar99);
      auVar126 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar7,auVar196);
      auVar99 = vblendps_avx(auVar126,auVar80,8);
      auVar102 = vandps_avx(auVar102,local_1b0);
      auVar101 = vandps_avx(auVar101,local_1b0);
      auVar98 = vmaxps_avx(auVar102,auVar101);
      auVar102 = vandps_avx(auVar17,local_1b0);
      auVar101 = vandps_avx(auVar99,local_1b0);
      auVar102 = vmaxps_avx(auVar102,auVar101);
      auVar102 = vmaxps_avx(auVar98,auVar102);
      auVar101 = vmovshdup_avx(auVar102);
      auVar101 = vmaxss_avx(auVar101,auVar102);
      auVar102 = vshufpd_avx(auVar102,auVar102,1);
      auVar102 = vmaxss_avx(auVar102,auVar101);
      lVar21 = (long)iVar12 * 0x44;
      auVar101 = vmovshdup_avx(auVar147);
      uVar95 = auVar101._0_8_;
      local_5c0._8_8_ = uVar95;
      local_5c0._0_8_ = uVar95;
      local_5c0._16_8_ = uVar95;
      local_5c0._24_8_ = uVar95;
      auVar137 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21 + 0x484);
      auVar101 = vmovshdup_avx(auVar125);
      uVar95 = auVar101._0_8_;
      local_660._8_8_ = uVar95;
      local_660._0_8_ = uVar95;
      local_660._16_8_ = uVar95;
      local_660._24_8_ = uVar95;
      auVar191 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21 + 0x908);
      uVar216 = auVar97._0_4_;
      local_780._4_4_ = uVar216;
      local_780._0_4_ = uVar216;
      local_780._8_4_ = uVar216;
      local_780._12_4_ = uVar216;
      local_780._16_4_ = uVar216;
      local_780._20_4_ = uVar216;
      local_780._24_4_ = uVar216;
      local_780._28_4_ = uVar216;
      auVar101 = vmovshdup_avx(auVar97);
      uVar95 = auVar101._0_8_;
      local_7a0._8_8_ = uVar95;
      local_7a0._0_8_ = uVar95;
      local_7a0._16_8_ = uVar95;
      local_7a0._24_8_ = uVar95;
      fVar115 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      fVar117 = *(float *)(catmullrom_basis0 + lVar21 + 0xd90);
      fVar119 = *(float *)(catmullrom_basis0 + lVar21 + 0xd94);
      fVar238 = *(float *)(catmullrom_basis0 + lVar21 + 0xd98);
      fVar239 = *(float *)(catmullrom_basis0 + lVar21 + 0xd9c);
      fVar145 = *(float *)(catmullrom_basis0 + lVar21 + 0xda0);
      fVar116 = *(float *)(catmullrom_basis0 + lVar21 + 0xda4);
      auVar86 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      local_6c0 = auVar126._0_4_;
      auVar101 = vmovshdup_avx(auVar126);
      local_7c0 = auVar101._0_8_;
      auVar187._0_4_ = fVar115 * local_6c0;
      auVar187._4_4_ = fVar117 * local_6c0;
      auVar187._8_4_ = fVar119 * local_6c0;
      auVar187._12_4_ = fVar238 * local_6c0;
      auVar187._16_4_ = fVar239 * local_6c0;
      auVar187._20_4_ = fVar145 * local_6c0;
      auVar187._24_4_ = fVar116 * local_6c0;
      auVar187._28_4_ = 0;
      fVar227 = auVar101._0_4_;
      auVar103._0_4_ = fVar227 * fVar115;
      fVar232 = auVar101._4_4_;
      auVar103._4_4_ = fVar232 * fVar117;
      auVar103._8_4_ = fVar227 * fVar119;
      auVar103._12_4_ = fVar232 * fVar238;
      auVar103._16_4_ = fVar227 * fVar239;
      auVar103._20_4_ = fVar232 * fVar145;
      auVar103._24_4_ = fVar227 * fVar116;
      auVar103._28_4_ = 0;
      auVar101 = vfmadd231ps_fma(auVar187,auVar191,local_780);
      auVar17 = vfmadd231ps_fma(auVar103,auVar191,local_7a0);
      uVar94 = auVar125._0_4_;
      local_6e0._4_4_ = uVar94;
      local_6e0._0_4_ = uVar94;
      local_6e0._8_4_ = uVar94;
      local_6e0._12_4_ = uVar94;
      local_6e0._16_4_ = uVar94;
      local_6e0._20_4_ = uVar94;
      local_6e0._24_4_ = uVar94;
      local_6e0._28_4_ = uVar94;
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar137,local_6e0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,local_660);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21);
      uVar94 = auVar147._0_4_;
      local_6a0._4_4_ = uVar94;
      local_6a0._0_4_ = uVar94;
      local_6a0._8_4_ = uVar94;
      local_6a0._12_4_ = uVar94;
      local_6a0._16_4_ = uVar94;
      local_6a0._20_4_ = uVar94;
      local_6a0._24_4_ = uVar94;
      local_6a0._28_4_ = uVar94;
      auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar103,local_6a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_5c0);
      auVar187 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x908);
      fVar118 = *(float *)(catmullrom_basis1 + lVar21 + 0xd8c);
      fVar120 = *(float *)(catmullrom_basis1 + lVar21 + 0xd90);
      fVar121 = *(float *)(catmullrom_basis1 + lVar21 + 0xd94);
      fVar122 = *(float *)(catmullrom_basis1 + lVar21 + 0xd98);
      fVar123 = *(float *)(catmullrom_basis1 + lVar21 + 0xd9c);
      fVar72 = *(float *)(catmullrom_basis1 + lVar21 + 0xda0);
      fVar73 = *(float *)(catmullrom_basis1 + lVar21 + 0xda4);
      auVar9._4_4_ = fVar120 * local_6c0;
      auVar9._0_4_ = fVar118 * local_6c0;
      auVar9._8_4_ = fVar121 * local_6c0;
      auVar9._12_4_ = fVar122 * local_6c0;
      auVar9._16_4_ = fVar123 * local_6c0;
      auVar9._20_4_ = fVar72 * local_6c0;
      auVar9._24_4_ = fVar73 * local_6c0;
      auVar9._28_4_ = local_6c0;
      auVar99 = vfmadd231ps_fma(auVar9,auVar187,local_780);
      auVar181._4_4_ = fVar232 * fVar120;
      auVar181._0_4_ = fVar227 * fVar118;
      auVar181._8_4_ = fVar227 * fVar121;
      auVar181._12_4_ = fVar232 * fVar122;
      auVar181._16_4_ = fVar227 * fVar123;
      auVar181._20_4_ = fVar232 * fVar72;
      auVar181._24_4_ = fVar227 * fVar73;
      auVar181._28_4_ = uVar216;
      auVar98 = vfmadd231ps_fma(auVar181,auVar187,local_7a0);
      auVar9 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x484);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar9,local_6e0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar9,local_660);
      auVar181 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar181,local_6a0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar181,local_5c0);
      auVar132 = ZEXT1632(auVar99);
      auVar188 = ZEXT1632(auVar101);
      auVar139 = vsubps_avx(auVar132,auVar188);
      auVar154 = ZEXT1632(auVar98);
      auVar104 = ZEXT1632(auVar17);
      auVar114 = vsubps_avx(auVar154,auVar104);
      auVar105._0_4_ = auVar17._0_4_ * auVar139._0_4_;
      auVar105._4_4_ = auVar17._4_4_ * auVar139._4_4_;
      auVar105._8_4_ = auVar17._8_4_ * auVar139._8_4_;
      auVar105._12_4_ = auVar17._12_4_ * auVar139._12_4_;
      auVar105._16_4_ = auVar139._16_4_ * 0.0;
      auVar105._20_4_ = auVar139._20_4_ * 0.0;
      auVar105._24_4_ = auVar139._24_4_ * 0.0;
      auVar105._28_4_ = 0;
      fVar220 = auVar114._0_4_;
      auVar133._0_4_ = fVar220 * auVar101._0_4_;
      fVar226 = auVar114._4_4_;
      auVar133._4_4_ = fVar226 * auVar101._4_4_;
      fVar233 = auVar114._8_4_;
      auVar133._8_4_ = fVar233 * auVar101._8_4_;
      fVar234 = auVar114._12_4_;
      auVar133._12_4_ = fVar234 * auVar101._12_4_;
      fVar235 = auVar114._16_4_;
      auVar133._16_4_ = fVar235 * 0.0;
      fVar236 = auVar114._20_4_;
      auVar133._20_4_ = fVar236 * 0.0;
      fVar237 = auVar114._24_4_;
      auVar133._24_4_ = fVar237 * 0.0;
      auVar133._28_4_ = 0;
      auVar105 = vsubps_avx(auVar105,auVar133);
      auVar101 = vpermilps_avx(*pauVar1,0xff);
      uVar95 = auVar101._0_8_;
      local_80._8_8_ = uVar95;
      local_80._0_8_ = uVar95;
      local_80._16_8_ = uVar95;
      local_80._24_8_ = uVar95;
      auVar17 = vpermilps_avx(*pauVar2,0xff);
      uVar95 = auVar17._0_8_;
      local_a0._8_8_ = uVar95;
      local_a0._0_8_ = uVar95;
      local_a0._16_8_ = uVar95;
      local_a0._24_8_ = uVar95;
      auVar17 = vpermilps_avx(*pauVar3,0xff);
      uVar95 = auVar17._0_8_;
      local_c0._8_8_ = uVar95;
      local_c0._0_8_ = uVar95;
      local_c0._16_8_ = uVar95;
      local_c0._24_8_ = uVar95;
      auVar81._12_4_ = fStack_734;
      auVar81._0_12_ = *(undefined1 (*) [12])*pauVar4;
      auVar17 = vpermilps_avx(auVar81,0xff);
      local_e0 = auVar17._0_8_;
      fVar146 = auVar17._0_4_;
      auVar189._0_4_ = fVar115 * fVar146;
      fVar115 = auVar17._4_4_;
      auVar189._4_4_ = fVar117 * fVar115;
      auVar189._8_4_ = fVar119 * fVar146;
      auVar189._12_4_ = fVar238 * fVar115;
      auVar189._16_4_ = fVar239 * fVar146;
      auVar189._20_4_ = fVar145 * fVar115;
      auVar189._24_4_ = fVar116 * fVar146;
      auVar189._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar189,local_c0,auVar191);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_a0,auVar137);
      auVar99 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar112._4_4_ = fVar120 * fVar115;
      auVar112._0_4_ = fVar118 * fVar146;
      auVar112._8_4_ = fVar121 * fVar146;
      auVar112._12_4_ = fVar122 * fVar115;
      auVar112._16_4_ = fVar123 * fVar146;
      auVar112._20_4_ = fVar72 * fVar115;
      auVar112._24_4_ = fVar73 * fVar146;
      auVar112._28_4_ = auVar103._28_4_;
      auVar17 = vfmadd231ps_fma(auVar112,auVar187,local_c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,local_a0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar181,local_80);
      auVar18._4_4_ = fVar226 * fVar226;
      auVar18._0_4_ = fVar220 * fVar220;
      auVar18._8_4_ = fVar233 * fVar233;
      auVar18._12_4_ = fVar234 * fVar234;
      auVar18._16_4_ = fVar235 * fVar235;
      auVar18._20_4_ = fVar236 * fVar236;
      auVar18._24_4_ = fVar237 * fVar237;
      auVar18._28_4_ = auVar101._4_4_;
      auVar101 = vfmadd231ps_fma(auVar18,auVar139,auVar139);
      auVar112 = vmaxps_avx(ZEXT1632(auVar99),ZEXT1632(auVar98));
      auVar19._4_4_ = auVar112._4_4_ * auVar112._4_4_ * auVar101._4_4_;
      auVar19._0_4_ = auVar112._0_4_ * auVar112._0_4_ * auVar101._0_4_;
      auVar19._8_4_ = auVar112._8_4_ * auVar112._8_4_ * auVar101._8_4_;
      auVar19._12_4_ = auVar112._12_4_ * auVar112._12_4_ * auVar101._12_4_;
      auVar19._16_4_ = auVar112._16_4_ * auVar112._16_4_ * 0.0;
      auVar19._20_4_ = auVar112._20_4_ * auVar112._20_4_ * 0.0;
      auVar19._24_4_ = auVar112._24_4_ * auVar112._24_4_ * 0.0;
      auVar19._28_4_ = auVar112._28_4_;
      auVar20._4_4_ = auVar105._4_4_ * auVar105._4_4_;
      auVar20._0_4_ = auVar105._0_4_ * auVar105._0_4_;
      auVar20._8_4_ = auVar105._8_4_ * auVar105._8_4_;
      auVar20._12_4_ = auVar105._12_4_ * auVar105._12_4_;
      auVar20._16_4_ = auVar105._16_4_ * auVar105._16_4_;
      auVar20._20_4_ = auVar105._20_4_ * auVar105._20_4_;
      auVar20._24_4_ = auVar105._24_4_ * auVar105._24_4_;
      auVar20._28_4_ = auVar105._28_4_;
      auVar112 = vcmpps_avx(auVar20,auVar19,2);
      auVar160 = ZEXT3264(auVar112);
      fVar146 = auVar102._0_4_ * 4.7683716e-07;
      auVar106._0_4_ = (float)iVar12;
      local_520._4_12_ = auVar97._4_12_;
      local_520._0_4_ = auVar106._0_4_;
      local_520._16_16_ = auVar158._16_16_;
      auVar106._4_4_ = auVar106._0_4_;
      auVar106._8_4_ = auVar106._0_4_;
      auVar106._12_4_ = auVar106._0_4_;
      auVar106._16_4_ = auVar106._0_4_;
      auVar106._20_4_ = auVar106._0_4_;
      auVar106._24_4_ = auVar106._0_4_;
      auVar106._28_4_ = auVar106._0_4_;
      auVar158 = vcmpps_avx(_DAT_02020f40,auVar106,1);
      auVar101 = vpermilps_avx(auVar147,0xaa);
      uVar95 = auVar101._0_8_;
      local_480._8_8_ = uVar95;
      local_480._0_8_ = uVar95;
      local_480._16_8_ = uVar95;
      local_480._24_8_ = uVar95;
      auVar17 = vpermilps_avx(auVar125,0xaa);
      uVar95 = auVar17._0_8_;
      local_460._8_8_ = uVar95;
      local_460._0_8_ = uVar95;
      local_460._16_8_ = uVar95;
      local_460._24_8_ = uVar95;
      auVar102 = vshufps_avx(auVar97,auVar97,0xaa);
      uVar95 = auVar102._0_8_;
      local_1a0._8_8_ = uVar95;
      local_1a0._0_8_ = uVar95;
      local_1a0._16_8_ = uVar95;
      local_1a0._24_8_ = uVar95;
      auVar102 = vshufps_avx(auVar126,auVar126,0xaa);
      uVar95 = auVar102._0_8_;
      register0x00001508 = uVar95;
      local_640 = uVar95;
      register0x00001510 = uVar95;
      register0x00001518 = uVar95;
      auVar224 = ZEXT3264(_local_640);
      auVar105 = auVar158 & auVar112;
      uVar90 = *(uint *)(ray + k * 4 + 0x30);
      local_540._0_16_ = ZEXT416(uVar90);
      fVar115 = fVar227;
      fVar117 = fVar232;
      fVar119 = fVar227;
      fVar238 = fVar232;
      fVar239 = fVar227;
      uStack_7b8 = local_7c0;
      uStack_7b0 = local_7c0;
      uStack_7a8 = local_7c0;
      fStack_6bc = local_6c0;
      fStack_6b8 = local_6c0;
      fStack_6b4 = local_6c0;
      fStack_6b0 = local_6c0;
      fStack_6ac = local_6c0;
      fStack_6a8 = local_6c0;
      fStack_6a4 = local_6c0;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar105[0x1f]) {
        auVar215 = ZEXT3264(auVar111);
        auVar210 = ZEXT3264(auVar206);
        auVar144 = ZEXT3264(local_660);
        auVar219 = ZEXT3264(local_780);
        auVar231 = ZEXT3264(local_7a0);
        auVar197 = ZEXT3264(CONCAT428(local_6c0,
                                      CONCAT424(local_6c0,
                                                CONCAT420(local_6c0,
                                                          CONCAT416(local_6c0,
                                                                    CONCAT412(local_6c0,
                                                                              CONCAT48(local_6c0,
                                                                                       CONCAT44(
                                                  local_6c0,local_6c0))))))));
        auVar203 = ZEXT3264(local_6e0);
        auVar193 = ZEXT3264(local_6a0);
      }
      else {
        local_200 = vandps_avx(auVar112,auVar158);
        fVar220 = auVar102._0_4_;
        fVar226 = auVar102._4_4_;
        auVar158._4_4_ = fVar226 * fVar120;
        auVar158._0_4_ = fVar220 * fVar118;
        auVar158._8_4_ = fVar220 * fVar121;
        auVar158._12_4_ = fVar226 * fVar122;
        auVar158._16_4_ = fVar220 * fVar123;
        auVar158._20_4_ = fVar226 * fVar72;
        auVar158._24_4_ = fVar220 * fVar73;
        auVar158._28_4_ = local_200._28_4_;
        auVar102 = vfmadd213ps_fma(auVar187,local_1a0,auVar158);
        auVar102 = vfmadd213ps_fma(auVar9,local_460,ZEXT1632(auVar102));
        auVar102 = vfmadd213ps_fma(auVar181,local_480,ZEXT1632(auVar102));
        local_500._0_4_ = auVar86._0_4_;
        local_500._4_4_ = auVar86._4_4_;
        fStack_4f8 = auVar86._8_4_;
        fStack_4f4 = auVar86._12_4_;
        fStack_4f0 = auVar86._16_4_;
        fStack_4ec = auVar86._20_4_;
        fStack_4e8 = auVar86._24_4_;
        auVar107._0_4_ = fVar220 * (float)local_500._0_4_;
        auVar107._4_4_ = fVar226 * (float)local_500._4_4_;
        auVar107._8_4_ = fVar220 * fStack_4f8;
        auVar107._12_4_ = fVar226 * fStack_4f4;
        auVar107._16_4_ = fVar220 * fStack_4f0;
        auVar107._20_4_ = fVar226 * fStack_4ec;
        auVar107._24_4_ = fVar220 * fStack_4e8;
        auVar107._28_4_ = 0;
        auVar147 = vfmadd213ps_fma(auVar191,local_1a0,auVar107);
        auVar147 = vfmadd213ps_fma(auVar137,local_460,ZEXT1632(auVar147));
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21 + 0x1210);
        auVar137 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21 + 0x1694);
        auVar191 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar21 + 0x1b18);
        fVar145 = *(float *)(catmullrom_basis0 + lVar21 + 0x1f9c);
        fVar116 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa0);
        fVar118 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa4);
        fVar120 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa8);
        fVar121 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fac);
        fVar122 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb0);
        fVar123 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb4);
        auVar180._0_4_ = local_6c0 * fVar145;
        auVar180._4_4_ = local_6c0 * fVar116;
        auVar180._8_4_ = local_6c0 * fVar118;
        auVar180._12_4_ = local_6c0 * fVar120;
        auVar180._16_4_ = local_6c0 * fVar121;
        auVar180._20_4_ = local_6c0 * fVar122;
        auVar180._24_4_ = local_6c0 * fVar123;
        auVar180._28_4_ = 0;
        auVar22._4_4_ = fVar232 * fVar116;
        auVar22._0_4_ = fVar227 * fVar145;
        auVar22._8_4_ = fVar227 * fVar118;
        auVar22._12_4_ = fVar232 * fVar120;
        auVar22._16_4_ = fVar227 * fVar121;
        auVar22._20_4_ = fVar232 * fVar122;
        auVar22._24_4_ = fVar227 * fVar123;
        auVar22._28_4_ = auVar17._4_4_;
        auVar23._4_4_ = fVar226 * fVar116;
        auVar23._0_4_ = fVar220 * fVar145;
        auVar23._8_4_ = fVar220 * fVar118;
        auVar23._12_4_ = fVar226 * fVar120;
        auVar23._16_4_ = fVar220 * fVar121;
        auVar23._20_4_ = fVar226 * fVar122;
        auVar23._24_4_ = fVar220 * fVar123;
        auVar23._28_4_ = fVar226;
        auVar17 = vfmadd231ps_fma(auVar180,auVar191,local_780);
        auVar125 = vfmadd231ps_fma(auVar22,auVar191,local_7a0);
        auVar97 = vfmadd231ps_fma(auVar23,local_1a0,auVar191);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,local_6e0);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar137,local_660);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar137,local_460);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar158,local_6a0);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar158,local_5c0);
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_480,auVar158);
        fVar145 = *(float *)(catmullrom_basis1 + lVar21 + 0x1f9c);
        fVar116 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa0);
        fVar118 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa4);
        fVar120 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa8);
        fVar121 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fac);
        fVar122 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb0);
        fVar123 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb4);
        auVar137._4_4_ = local_6c0 * fVar116;
        auVar137._0_4_ = local_6c0 * fVar145;
        auVar137._8_4_ = local_6c0 * fVar118;
        auVar137._12_4_ = local_6c0 * fVar120;
        auVar137._16_4_ = local_6c0 * fVar121;
        auVar137._20_4_ = local_6c0 * fVar122;
        auVar137._24_4_ = local_6c0 * fVar123;
        auVar137._28_4_ = auVar158._28_4_;
        auVar191._4_4_ = fVar232 * fVar116;
        auVar191._0_4_ = fVar227 * fVar145;
        auVar191._8_4_ = fVar227 * fVar118;
        auVar191._12_4_ = fVar232 * fVar120;
        auVar191._16_4_ = fVar227 * fVar121;
        auVar191._20_4_ = fVar232 * fVar122;
        auVar191._24_4_ = fVar227 * fVar123;
        auVar191._28_4_ = fVar232;
        auVar24._4_4_ = fVar116 * fVar226;
        auVar24._0_4_ = fVar145 * fVar220;
        auVar24._8_4_ = fVar118 * fVar220;
        auVar24._12_4_ = fVar120 * fVar226;
        auVar24._16_4_ = fVar121 * fVar220;
        auVar24._20_4_ = fVar122 * fVar226;
        auVar24._24_4_ = fVar123 * fVar220;
        auVar24._28_4_ = auVar101._4_4_;
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x1b18);
        auVar101 = vfmadd231ps_fma(auVar137,auVar158,local_780);
        auVar126 = vfmadd231ps_fma(auVar191,auVar158,local_7a0);
        auVar161 = vfmadd231ps_fma(auVar24,auVar158,local_1a0);
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x1694);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar158,local_6e0);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar158,local_660);
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),local_460,auVar158);
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x1210);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar158,local_6a0);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar158,local_5c0);
        auVar134._8_4_ = 0x7fffffff;
        auVar134._0_8_ = 0x7fffffff7fffffff;
        auVar134._12_4_ = 0x7fffffff;
        auVar134._16_4_ = 0x7fffffff;
        auVar134._20_4_ = 0x7fffffff;
        auVar134._24_4_ = 0x7fffffff;
        auVar134._28_4_ = 0x7fffffff;
        auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),local_480,auVar158);
        auVar158 = vandps_avx(ZEXT1632(auVar17),auVar134);
        auVar137 = vandps_avx(ZEXT1632(auVar125),auVar134);
        auVar137 = vmaxps_avx(auVar158,auVar137);
        auVar158 = vandps_avx(ZEXT1632(auVar97),auVar134);
        auVar158 = vmaxps_avx(auVar137,auVar158);
        auVar155._4_4_ = fVar146;
        auVar155._0_4_ = fVar146;
        auVar155._8_4_ = fVar146;
        auVar155._12_4_ = fVar146;
        auVar155._16_4_ = fVar146;
        auVar155._20_4_ = fVar146;
        auVar155._24_4_ = fVar146;
        auVar155._28_4_ = fVar146;
        auVar158 = vcmpps_avx(auVar158,auVar155,1);
        auVar191 = vblendvps_avx(ZEXT1632(auVar17),auVar139,auVar158);
        auVar187 = vblendvps_avx(ZEXT1632(auVar125),auVar114,auVar158);
        auVar158 = vandps_avx(ZEXT1632(auVar101),auVar134);
        auVar137 = vandps_avx(ZEXT1632(auVar126),auVar134);
        auVar9 = vmaxps_avx(auVar158,auVar137);
        auVar158 = vandps_avx(ZEXT1632(auVar161),auVar134);
        auVar158 = vmaxps_avx(auVar9,auVar158);
        auVar181 = vcmpps_avx(auVar158,auVar155,1);
        auVar158 = vblendvps_avx(ZEXT1632(auVar101),auVar139,auVar181);
        auVar9 = vblendvps_avx(ZEXT1632(auVar126),auVar114,auVar181);
        auVar101 = vfmadd213ps_fma(auVar103,local_480,ZEXT1632(auVar147));
        auVar17 = vfmadd213ps_fma(auVar191,auVar191,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar187,auVar187);
        auVar103 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar145 = auVar103._0_4_;
        fVar116 = auVar103._4_4_;
        fVar118 = auVar103._8_4_;
        fVar120 = auVar103._12_4_;
        fVar121 = auVar103._16_4_;
        fVar122 = auVar103._20_4_;
        fVar123 = auVar103._24_4_;
        auVar139._4_4_ = fVar116 * fVar116 * fVar116 * auVar17._4_4_ * -0.5;
        auVar139._0_4_ = fVar145 * fVar145 * fVar145 * auVar17._0_4_ * -0.5;
        auVar139._8_4_ = fVar118 * fVar118 * fVar118 * auVar17._8_4_ * -0.5;
        auVar139._12_4_ = fVar120 * fVar120 * fVar120 * auVar17._12_4_ * -0.5;
        auVar139._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar139._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar139._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar139._28_4_ = auVar137._28_4_;
        auVar230._8_4_ = 0x3fc00000;
        auVar230._0_8_ = 0x3fc000003fc00000;
        auVar230._12_4_ = 0x3fc00000;
        auVar230._16_4_ = 0x3fc00000;
        auVar230._20_4_ = 0x3fc00000;
        auVar230._24_4_ = 0x3fc00000;
        auVar230._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar139,auVar230,auVar103);
        fVar145 = auVar17._0_4_;
        fVar116 = auVar17._4_4_;
        auVar25._4_4_ = fVar116 * auVar187._4_4_;
        auVar25._0_4_ = fVar145 * auVar187._0_4_;
        fVar118 = auVar17._8_4_;
        auVar25._8_4_ = fVar118 * auVar187._8_4_;
        fVar120 = auVar17._12_4_;
        auVar25._12_4_ = fVar120 * auVar187._12_4_;
        auVar25._16_4_ = auVar187._16_4_ * 0.0;
        auVar25._20_4_ = auVar187._20_4_ * 0.0;
        auVar25._24_4_ = auVar187._24_4_ * 0.0;
        auVar25._28_4_ = 0;
        auVar26._4_4_ = fVar116 * -auVar191._4_4_;
        auVar26._0_4_ = fVar145 * -auVar191._0_4_;
        auVar26._8_4_ = fVar118 * -auVar191._8_4_;
        auVar26._12_4_ = fVar120 * -auVar191._12_4_;
        auVar26._16_4_ = -auVar191._16_4_ * 0.0;
        auVar26._20_4_ = -auVar191._20_4_ * 0.0;
        auVar26._24_4_ = -auVar191._24_4_ * 0.0;
        auVar26._28_4_ = auVar103._28_4_;
        auVar17 = vfmadd213ps_fma(auVar158,auVar158,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,auVar9);
        auVar137 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar27._28_4_ = auVar181._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar120 * 0.0,
                                CONCAT48(fVar118 * 0.0,CONCAT44(fVar116 * 0.0,fVar145 * 0.0))));
        fVar145 = auVar137._0_4_;
        fVar116 = auVar137._4_4_;
        fVar118 = auVar137._8_4_;
        fVar120 = auVar137._12_4_;
        fVar121 = auVar137._16_4_;
        fVar122 = auVar137._20_4_;
        fVar123 = auVar137._24_4_;
        auVar28._4_4_ = fVar116 * fVar116 * fVar116 * auVar17._4_4_ * -0.5;
        auVar28._0_4_ = fVar145 * fVar145 * fVar145 * auVar17._0_4_ * -0.5;
        auVar28._8_4_ = fVar118 * fVar118 * fVar118 * auVar17._8_4_ * -0.5;
        auVar28._12_4_ = fVar120 * fVar120 * fVar120 * auVar17._12_4_ * -0.5;
        auVar28._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar28._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar28._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar28._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar28,auVar230,auVar137);
        fVar145 = auVar17._0_4_;
        auVar213._0_4_ = auVar9._0_4_ * fVar145;
        fVar116 = auVar17._4_4_;
        auVar213._4_4_ = auVar9._4_4_ * fVar116;
        fVar118 = auVar17._8_4_;
        auVar213._8_4_ = auVar9._8_4_ * fVar118;
        fVar120 = auVar17._12_4_;
        auVar213._12_4_ = auVar9._12_4_ * fVar120;
        auVar213._16_4_ = auVar9._16_4_ * 0.0;
        auVar213._20_4_ = auVar9._20_4_ * 0.0;
        auVar213._24_4_ = auVar9._24_4_ * 0.0;
        auVar213._28_4_ = 0;
        auVar29._4_4_ = -auVar158._4_4_ * fVar116;
        auVar29._0_4_ = -auVar158._0_4_ * fVar145;
        auVar29._8_4_ = -auVar158._8_4_ * fVar118;
        auVar29._12_4_ = -auVar158._12_4_ * fVar120;
        auVar29._16_4_ = -auVar158._16_4_ * 0.0;
        auVar29._20_4_ = -auVar158._20_4_ * 0.0;
        auVar29._24_4_ = -auVar158._24_4_ * 0.0;
        auVar29._28_4_ = auVar9._28_4_;
        auVar30._28_4_ = auVar137._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar120 * 0.0,
                                CONCAT48(fVar118 * 0.0,CONCAT44(fVar116 * 0.0,fVar145 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar99),auVar188);
        auVar158 = ZEXT1632(auVar99);
        auVar147 = vfmadd213ps_fma(auVar26,auVar158,auVar104);
        auVar125 = vfmadd213ps_fma(auVar27,auVar158,ZEXT1632(auVar101));
        auVar161 = vfnmadd213ps_fma(auVar25,auVar158,auVar188);
        auVar97 = vfmadd213ps_fma(auVar213,ZEXT1632(auVar98),auVar132);
        auVar169 = vfnmadd213ps_fma(auVar26,auVar158,auVar104);
        auVar158 = ZEXT1632(auVar98);
        auVar126 = vfmadd213ps_fma(auVar29,auVar158,auVar154);
        auVar189 = ZEXT1632(auVar99);
        auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar101),auVar189,auVar27);
        auVar101 = vfmadd213ps_fma(auVar30,auVar158,ZEXT1632(auVar102));
        auVar96 = vfnmadd213ps_fma(auVar213,auVar158,auVar132);
        auVar124 = vfnmadd213ps_fma(auVar29,auVar158,auVar154);
        auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar98),auVar30);
        auVar158 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar169));
        auVar137 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar168));
        auVar104._4_4_ = auVar168._4_4_ * auVar158._4_4_;
        auVar104._0_4_ = auVar168._0_4_ * auVar158._0_4_;
        auVar104._8_4_ = auVar168._8_4_ * auVar158._8_4_;
        auVar104._12_4_ = auVar168._12_4_ * auVar158._12_4_;
        auVar104._16_4_ = auVar158._16_4_ * 0.0;
        auVar104._20_4_ = auVar158._20_4_ * 0.0;
        auVar104._24_4_ = auVar158._24_4_ * 0.0;
        auVar104._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar169),auVar137);
        auVar132._4_4_ = auVar137._4_4_ * auVar161._4_4_;
        auVar132._0_4_ = auVar137._0_4_ * auVar161._0_4_;
        auVar132._8_4_ = auVar137._8_4_ * auVar161._8_4_;
        auVar132._12_4_ = auVar137._12_4_ * auVar161._12_4_;
        auVar132._16_4_ = auVar137._16_4_ * 0.0;
        auVar132._20_4_ = auVar137._20_4_ * 0.0;
        auVar132._24_4_ = auVar137._24_4_ * 0.0;
        auVar132._28_4_ = auVar137._28_4_;
        auVar137 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar161));
        auVar102 = vfmsub231ps_fma(auVar132,ZEXT1632(auVar168),auVar137);
        auVar154._4_4_ = auVar169._4_4_ * auVar137._4_4_;
        auVar154._0_4_ = auVar169._0_4_ * auVar137._0_4_;
        auVar154._8_4_ = auVar169._8_4_ * auVar137._8_4_;
        auVar154._12_4_ = auVar169._12_4_ * auVar137._12_4_;
        auVar154._16_4_ = auVar137._16_4_ * 0.0;
        auVar154._20_4_ = auVar137._20_4_ * 0.0;
        auVar154._24_4_ = auVar137._24_4_ * 0.0;
        auVar154._28_4_ = auVar137._28_4_;
        auVar181 = ZEXT1632(auVar161);
        auVar161 = vfmsub231ps_fma(auVar154,auVar181,auVar158);
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar161),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
        auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar99));
        auVar105 = vcmpps_avx(ZEXT1632(auVar102),ZEXT832(0) << 0x20,2);
        auVar158 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar17),auVar105);
        auVar137 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar147),auVar105);
        auVar191 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar125),auVar105);
        auVar103 = vblendvps_avx(auVar181,ZEXT1632(auVar97),auVar105);
        auVar187 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar126),auVar105);
        auVar9 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar101),auVar105);
        auVar181 = vblendvps_avx(ZEXT1632(auVar97),auVar181,auVar105);
        auVar112 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar169),auVar105);
        auVar102 = vpackssdw_avx(local_200._0_16_,local_200._16_16_);
        auVar139 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar168),auVar105);
        auVar18 = vsubps_avx(auVar181,auVar158);
        auVar19 = vsubps_avx(auVar112,auVar137);
        auVar20 = vsubps_avx(auVar139,auVar191);
        auVar104 = vsubps_avx(auVar158,auVar103);
        auVar132 = vsubps_avx(auVar137,auVar187);
        auVar133 = vsubps_avx(auVar191,auVar9);
        auVar188._4_4_ = auVar20._4_4_ * auVar158._4_4_;
        auVar188._0_4_ = auVar20._0_4_ * auVar158._0_4_;
        auVar188._8_4_ = auVar20._8_4_ * auVar158._8_4_;
        auVar188._12_4_ = auVar20._12_4_ * auVar158._12_4_;
        auVar188._16_4_ = auVar20._16_4_ * auVar158._16_4_;
        auVar188._20_4_ = auVar20._20_4_ * auVar158._20_4_;
        auVar188._24_4_ = auVar20._24_4_ * auVar158._24_4_;
        auVar188._28_4_ = auVar139._28_4_;
        auVar101 = vfmsub231ps_fma(auVar188,auVar191,auVar18);
        auVar31._4_4_ = auVar18._4_4_ * auVar137._4_4_;
        auVar31._0_4_ = auVar18._0_4_ * auVar137._0_4_;
        auVar31._8_4_ = auVar18._8_4_ * auVar137._8_4_;
        auVar31._12_4_ = auVar18._12_4_ * auVar137._12_4_;
        auVar31._16_4_ = auVar18._16_4_ * auVar137._16_4_;
        auVar31._20_4_ = auVar18._20_4_ * auVar137._20_4_;
        auVar31._24_4_ = auVar18._24_4_ * auVar137._24_4_;
        auVar31._28_4_ = auVar181._28_4_;
        auVar17 = vfmsub231ps_fma(auVar31,auVar158,auVar19);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar101));
        auVar108._0_4_ = auVar19._0_4_ * auVar191._0_4_;
        auVar108._4_4_ = auVar19._4_4_ * auVar191._4_4_;
        auVar108._8_4_ = auVar19._8_4_ * auVar191._8_4_;
        auVar108._12_4_ = auVar19._12_4_ * auVar191._12_4_;
        auVar108._16_4_ = auVar19._16_4_ * auVar191._16_4_;
        auVar108._20_4_ = auVar19._20_4_ * auVar191._20_4_;
        auVar108._24_4_ = auVar19._24_4_ * auVar191._24_4_;
        auVar108._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar108,auVar137,auVar20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar160 = ZEXT1664(auVar17);
        auVar109._0_4_ = auVar133._0_4_ * auVar103._0_4_;
        auVar109._4_4_ = auVar133._4_4_ * auVar103._4_4_;
        auVar109._8_4_ = auVar133._8_4_ * auVar103._8_4_;
        auVar109._12_4_ = auVar133._12_4_ * auVar103._12_4_;
        auVar109._16_4_ = auVar133._16_4_ * auVar103._16_4_;
        auVar109._20_4_ = auVar133._20_4_ * auVar103._20_4_;
        auVar109._24_4_ = auVar133._24_4_ * auVar103._24_4_;
        auVar109._28_4_ = 0;
        auVar101 = vfmsub231ps_fma(auVar109,auVar104,auVar9);
        auVar32._4_4_ = auVar132._4_4_ * auVar9._4_4_;
        auVar32._0_4_ = auVar132._0_4_ * auVar9._0_4_;
        auVar32._8_4_ = auVar132._8_4_ * auVar9._8_4_;
        auVar32._12_4_ = auVar132._12_4_ * auVar9._12_4_;
        auVar32._16_4_ = auVar132._16_4_ * auVar9._16_4_;
        auVar32._20_4_ = auVar132._20_4_ * auVar9._20_4_;
        auVar32._24_4_ = auVar132._24_4_ * auVar9._24_4_;
        auVar32._28_4_ = auVar9._28_4_;
        auVar99 = vfmsub231ps_fma(auVar32,auVar187,auVar133);
        auVar33._4_4_ = auVar104._4_4_ * auVar187._4_4_;
        auVar33._0_4_ = auVar104._0_4_ * auVar187._0_4_;
        auVar33._8_4_ = auVar104._8_4_ * auVar187._8_4_;
        auVar33._12_4_ = auVar104._12_4_ * auVar187._12_4_;
        auVar33._16_4_ = auVar104._16_4_ * auVar187._16_4_;
        auVar33._20_4_ = auVar104._20_4_ * auVar187._20_4_;
        auVar33._24_4_ = auVar104._24_4_ * auVar187._24_4_;
        auVar33._28_4_ = auVar112._28_4_;
        auVar147 = vfmsub231ps_fma(auVar33,auVar132,auVar103);
        auVar101 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar101));
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar99));
        auVar103 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar99));
        auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
        auVar101 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
        auVar102 = vpand_avx(auVar101,auVar102);
        auVar103 = vpmovsxwd_avx2(auVar102);
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0x7f,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0xbf,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar103[0x1f]) {
LAB_016c999b:
          auVar193 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          auVar215 = ZEXT3264(auVar111);
          auVar210 = ZEXT3264(auVar206);
        }
        else {
          auVar34._4_4_ = auVar19._4_4_ * auVar133._4_4_;
          auVar34._0_4_ = auVar19._0_4_ * auVar133._0_4_;
          auVar34._8_4_ = auVar19._8_4_ * auVar133._8_4_;
          auVar34._12_4_ = auVar19._12_4_ * auVar133._12_4_;
          auVar34._16_4_ = auVar19._16_4_ * auVar133._16_4_;
          auVar34._20_4_ = auVar19._20_4_ * auVar133._20_4_;
          auVar34._24_4_ = auVar19._24_4_ * auVar133._24_4_;
          auVar34._28_4_ = auVar103._28_4_;
          auVar97 = vfmsub231ps_fma(auVar34,auVar132,auVar20);
          auVar135._0_4_ = auVar20._0_4_ * auVar104._0_4_;
          auVar135._4_4_ = auVar20._4_4_ * auVar104._4_4_;
          auVar135._8_4_ = auVar20._8_4_ * auVar104._8_4_;
          auVar135._12_4_ = auVar20._12_4_ * auVar104._12_4_;
          auVar135._16_4_ = auVar20._16_4_ * auVar104._16_4_;
          auVar135._20_4_ = auVar20._20_4_ * auVar104._20_4_;
          auVar135._24_4_ = auVar20._24_4_ * auVar104._24_4_;
          auVar135._28_4_ = 0;
          auVar125 = vfmsub231ps_fma(auVar135,auVar18,auVar133);
          auVar35._4_4_ = auVar18._4_4_ * auVar132._4_4_;
          auVar35._0_4_ = auVar18._0_4_ * auVar132._0_4_;
          auVar35._8_4_ = auVar18._8_4_ * auVar132._8_4_;
          auVar35._12_4_ = auVar18._12_4_ * auVar132._12_4_;
          auVar35._16_4_ = auVar18._16_4_ * auVar132._16_4_;
          auVar35._20_4_ = auVar18._20_4_ * auVar132._20_4_;
          auVar35._24_4_ = auVar18._24_4_ * auVar132._24_4_;
          auVar35._28_4_ = auVar187._28_4_;
          auVar126 = vfmsub231ps_fma(auVar35,auVar104,auVar19);
          auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar125),ZEXT1632(auVar126));
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar97),_DAT_02020f00);
          auVar103 = vrcpps_avx(ZEXT1632(auVar147));
          auVar214._8_4_ = 0x3f800000;
          auVar214._0_8_ = &DAT_3f8000003f800000;
          auVar214._12_4_ = 0x3f800000;
          auVar214._16_4_ = 0x3f800000;
          auVar214._20_4_ = 0x3f800000;
          auVar214._24_4_ = 0x3f800000;
          auVar214._28_4_ = 0x3f800000;
          auVar101 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar147),auVar214);
          auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar103,auVar103);
          auVar190._0_4_ = auVar126._0_4_ * auVar191._0_4_;
          auVar190._4_4_ = auVar126._4_4_ * auVar191._4_4_;
          auVar190._8_4_ = auVar126._8_4_ * auVar191._8_4_;
          auVar190._12_4_ = auVar126._12_4_ * auVar191._12_4_;
          auVar190._16_4_ = auVar191._16_4_ * 0.0;
          auVar190._20_4_ = auVar191._20_4_ * 0.0;
          auVar190._24_4_ = auVar191._24_4_ * 0.0;
          auVar190._28_4_ = 0;
          auVar125 = vfmadd231ps_fma(auVar190,auVar137,ZEXT1632(auVar125));
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT1632(auVar97),auVar158);
          fVar145 = auVar101._0_4_;
          fVar116 = auVar101._4_4_;
          fVar118 = auVar101._8_4_;
          fVar120 = auVar101._12_4_;
          auVar191 = ZEXT1632(CONCAT412(fVar120 * auVar125._12_4_,
                                        CONCAT48(fVar118 * auVar125._8_4_,
                                                 CONCAT44(fVar116 * auVar125._4_4_,
                                                          fVar145 * auVar125._0_4_))));
          auVar110._4_4_ = uVar90;
          auVar110._0_4_ = uVar90;
          auVar110._8_4_ = uVar90;
          auVar110._12_4_ = uVar90;
          auVar110._16_4_ = uVar90;
          auVar110._20_4_ = uVar90;
          auVar110._24_4_ = uVar90;
          auVar110._28_4_ = uVar90;
          uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar136._4_4_ = uVar94;
          auVar136._0_4_ = uVar94;
          auVar136._8_4_ = uVar94;
          auVar136._12_4_ = uVar94;
          auVar136._16_4_ = uVar94;
          auVar136._20_4_ = uVar94;
          auVar136._24_4_ = uVar94;
          auVar136._28_4_ = uVar94;
          auVar158 = vcmpps_avx(auVar110,auVar191,2);
          auVar137 = vcmpps_avx(auVar191,auVar136,2);
          auVar158 = vandps_avx(auVar137,auVar158);
          auVar101 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
          auVar102 = vpand_avx(auVar102,auVar101);
          auVar158 = vpmovsxwd_avx2(auVar102);
          if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar158 >> 0x7f,0) == '\0') &&
                (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar158 >> 0xbf,0) == '\0') &&
              (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar158[0x1f]) goto LAB_016c999b;
          auVar158 = vcmpps_avx(ZEXT1632(auVar147),ZEXT832(0) << 0x20,4);
          auVar101 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
          auVar102 = vpand_avx(auVar102,auVar101);
          auVar158 = vpmovsxwd_avx2(auVar102);
          auVar193 = ZEXT3264(CONCAT824(uStack_548,
                                        CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
          auVar215 = ZEXT3264(auVar111);
          auVar210 = ZEXT3264(auVar206);
          if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar158 >> 0x7f,0) != '\0') ||
                (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar158 >> 0xbf,0) != '\0') ||
              (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar158[0x1f] < '\0') {
            auVar111 = ZEXT1632(CONCAT412(fVar120 * auVar17._12_4_,
                                          CONCAT48(fVar118 * auVar17._8_4_,
                                                   CONCAT44(fVar116 * auVar17._4_4_,
                                                            fVar145 * auVar17._0_4_))));
            auVar137 = ZEXT1632(CONCAT412(fVar120 * auVar99._12_4_,
                                          CONCAT48(fVar118 * auVar99._8_4_,
                                                   CONCAT44(fVar116 * auVar99._4_4_,
                                                            fVar145 * auVar99._0_4_))));
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = &DAT_3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar206 = vsubps_avx(auVar175,auVar111);
            auVar160 = ZEXT3264(auVar206);
            auVar206 = vblendvps_avx(auVar206,auVar111,auVar105);
            auVar215 = ZEXT3264(auVar206);
            auVar206 = vsubps_avx(auVar175,auVar137);
            local_220 = vblendvps_avx(auVar206,auVar137,auVar105);
            auVar193 = ZEXT3264(auVar158);
            auVar210 = ZEXT3264(auVar191);
          }
        }
        auVar231 = ZEXT3264(local_7a0);
        auVar224 = ZEXT3264(_local_640);
        auVar219 = ZEXT3264(local_780);
        auVar158 = auVar193._0_32_;
        if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar158 >> 0x7f,0) == '\0') &&
              (auVar193 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar158 >> 0xbf,0) == '\0') &&
            (auVar193 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar193[0x1f]) {
          auVar144 = ZEXT3264(local_660);
          auVar197 = ZEXT3264(CONCAT428(local_6c0,
                                        CONCAT424(local_6c0,
                                                  CONCAT420(local_6c0,
                                                            CONCAT416(local_6c0,
                                                                      CONCAT412(local_6c0,
                                                                                CONCAT48(local_6c0,
                                                                                         CONCAT44(
                                                  local_6c0,local_6c0))))))));
          auVar203 = ZEXT3264(local_6e0);
          auVar193 = ZEXT3264(local_6a0);
        }
        else {
          auVar206 = vsubps_avx(ZEXT1632(auVar98),auVar189);
          local_760 = auVar215._0_32_;
          auVar102 = vfmadd213ps_fma(auVar206,local_760,auVar189);
          fVar145 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar206._4_4_ = (auVar102._4_4_ + auVar102._4_4_) * fVar145;
          auVar206._0_4_ = (auVar102._0_4_ + auVar102._0_4_) * fVar145;
          auVar206._8_4_ = (auVar102._8_4_ + auVar102._8_4_) * fVar145;
          auVar206._12_4_ = (auVar102._12_4_ + auVar102._12_4_) * fVar145;
          auVar206._16_4_ = fVar145 * 0.0;
          auVar206._20_4_ = fVar145 * 0.0;
          auVar206._24_4_ = fVar145 * 0.0;
          auVar206._28_4_ = 0;
          local_5e0 = auVar210._0_32_;
          auVar206 = vcmpps_avx(local_5e0,auVar206,6);
          auVar111 = auVar158 & auVar206;
          auVar197 = ZEXT3264(CONCAT428(local_6c0,
                                        CONCAT424(local_6c0,
                                                  CONCAT420(local_6c0,
                                                            CONCAT416(local_6c0,
                                                                      CONCAT412(local_6c0,
                                                                                CONCAT48(local_6c0,
                                                                                         CONCAT44(
                                                  local_6c0,local_6c0))))))));
          auVar203 = ZEXT3264(local_6e0);
          auVar193 = ZEXT3264(local_6a0);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            local_2c0 = vandps_avx(auVar206,auVar158);
            auVar111._8_4_ = 0xbf800000;
            auVar111._0_8_ = 0xbf800000bf800000;
            auVar111._12_4_ = 0xbf800000;
            auVar111._16_4_ = 0xbf800000;
            auVar111._20_4_ = 0xbf800000;
            auVar111._24_4_ = 0xbf800000;
            auVar111._28_4_ = 0xbf800000;
            auVar156._8_4_ = 0x40000000;
            auVar156._0_8_ = 0x4000000040000000;
            auVar156._12_4_ = 0x40000000;
            auVar156._16_4_ = 0x40000000;
            auVar156._20_4_ = 0x40000000;
            auVar156._24_4_ = 0x40000000;
            auVar156._28_4_ = 0x40000000;
            auVar160 = ZEXT3264(auVar156);
            auVar102 = vfmadd213ps_fma(local_220,auVar156,auVar111);
            local_380 = local_760;
            local_220 = ZEXT1632(auVar102);
            auVar158 = local_220;
            local_360 = ZEXT1632(auVar102);
            local_340 = local_5e0;
            local_320 = 0;
            local_31c = iVar12;
            local_310 = uVar74;
            uStack_308 = uVar75;
            local_300 = local_720;
            uStack_2f8 = uStack_718;
            local_2f0 = local_730;
            uStack_2e8 = uStack_728;
            local_220 = auVar158;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar145 = 1.0 / auVar106._0_4_;
              local_2a0[0] = fVar145 * (auVar215._0_4_ + 0.0);
              local_2a0[1] = fVar145 * (auVar215._4_4_ + 1.0);
              local_2a0[2] = fVar145 * (auVar215._8_4_ + 2.0);
              local_2a0[3] = fVar145 * (auVar215._12_4_ + 3.0);
              fStack_290 = fVar145 * (auVar215._16_4_ + 4.0);
              fStack_28c = fVar145 * (auVar215._20_4_ + 5.0);
              fStack_288 = fVar145 * (auVar215._24_4_ + 6.0);
              fStack_284 = auVar215._28_4_ + 7.0;
              local_220._0_8_ = auVar102._0_8_;
              local_220._8_8_ = auVar102._8_8_;
              local_280 = local_220._0_8_;
              uStack_278 = local_220._8_8_;
              uStack_270 = 0;
              uStack_268 = 0;
              local_260 = local_5e0;
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar158 = vblendvps_avx(auVar138,local_5e0,local_2c0);
              auVar206 = vshufps_avx(auVar158,auVar158,0xb1);
              auVar206 = vminps_avx(auVar158,auVar206);
              auVar111 = vshufpd_avx(auVar206,auVar206,5);
              auVar206 = vminps_avx(auVar206,auVar111);
              auVar111 = vpermpd_avx2(auVar206,0x4e);
              auVar206 = vminps_avx(auVar206,auVar111);
              auVar206 = vcmpps_avx(auVar158,auVar206,0);
              auVar111 = local_2c0 & auVar206;
              auVar158 = local_2c0;
              if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar111 >> 0x7f,0) != '\0') ||
                    (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0xbf,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar111[0x1f] < '\0') {
                auVar158 = vandps_avx(auVar206,local_2c0);
              }
              uVar88 = vmovmskps_avx(auVar158);
              uVar90 = 0;
              for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                uVar90 = uVar90 + 1;
              }
              uVar89 = (ulong)uVar90;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar145 = local_2a0[uVar89];
                fVar116 = 1.0 - fVar145;
                auVar101 = ZEXT416((uint)fVar145);
                auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar101,
                                           ZEXT416(0xc0a00000));
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145 * 3.0)),
                                           ZEXT416((uint)(fVar145 + fVar145)),auVar205);
                auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar101,
                                           ZEXT416(0x40000000));
                auVar205 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116 * -3.0)),
                                           ZEXT416((uint)(fVar116 + fVar116)),auVar205);
                auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar145 * (fVar116 + fVar116))),
                                           ZEXT416((uint)fVar116),ZEXT416((uint)fVar116));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),auVar101,
                                           ZEXT416((uint)(fVar116 * -2.0)));
                fVar116 = auVar205._0_4_ * 0.5;
                fVar118 = auVar101._0_4_ * 0.5;
                auVar162._0_4_ = fVar118 * local_740;
                auVar162._4_4_ = fVar118 * fStack_73c;
                auVar162._8_4_ = fVar118 * fStack_738;
                auVar162._12_4_ = fVar118 * fStack_734;
                auVar127._4_4_ = fVar116;
                auVar127._0_4_ = fVar116;
                auVar127._8_4_ = fVar116;
                auVar127._12_4_ = fVar116;
                auVar205 = vfmadd132ps_fma(auVar127,auVar162,*pauVar3);
                fVar116 = auVar102._0_4_ * 0.5;
                auVar163._4_4_ = fVar116;
                auVar163._0_4_ = fVar116;
                auVar163._8_4_ = fVar116;
                auVar163._12_4_ = fVar116;
                auVar205 = vfmadd132ps_fma(auVar163,auVar205,*pauVar2);
                uVar94 = *(undefined4 *)((long)&local_280 + uVar89 * 4);
                fVar116 = auVar17._0_4_ * 0.5;
                auVar193 = ZEXT3264(local_6a0);
                auVar148._4_4_ = fVar116;
                auVar148._0_4_ = fVar116;
                auVar148._8_4_ = fVar116;
                auVar148._12_4_ = fVar116;
                auVar205 = vfmadd132ps_fma(auVar148,auVar205,*pauVar1);
                auVar160 = ZEXT1664(auVar205);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar89 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar205._0_4_;
                uVar216 = vextractps_avx(auVar205,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar216;
                uVar216 = vextractps_avx(auVar205,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar216;
                *(float *)(ray + k * 4 + 0xf0) = fVar145;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar94;
                *(uint *)(ray + k * 4 + 0x110) = uVar11;
                *(uint *)(ray + k * 4 + 0x120) = uVar87;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_800._4_4_ = uVar87;
                local_800._0_4_ = uVar87;
                local_800._8_4_ = uVar87;
                local_800._12_4_ = uVar87;
                local_600 = (undefined1  [8])CONCAT44(uVar11,uVar11);
                _local_600 = CONCAT412(uVar11,CONCAT48(uVar11,local_600));
                _local_600 = ZEXT1632(_local_600);
                local_620 = ZEXT1632(*pauVar2);
                local_4a0 = ZEXT1632(*pauVar3);
                _local_4c0 = ZEXT1632(*pauVar4);
                local_4e0 = ZEXT1632(*local_668);
                local_5a0 = local_2c0;
                _local_500 = auVar114;
                do {
                  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar145 = local_2a0[uVar89];
                  auVar130._4_4_ = fVar145;
                  auVar130._0_4_ = fVar145;
                  auVar130._8_4_ = fVar145;
                  auVar130._12_4_ = fVar145;
                  local_3d0 = *(undefined4 *)((long)&local_280 + uVar89 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar89 * 4);
                  fVar116 = 1.0 - fVar145;
                  auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                             ZEXT416(0xc0a00000));
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145 * 3.0)),
                                             ZEXT416((uint)(fVar145 + fVar145)),auVar102);
                  auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar130,
                                             ZEXT416(0x40000000));
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar116 * fVar116 * -3.0)),
                                             ZEXT416((uint)(fVar116 + fVar116)),auVar102);
                  auVar99 = vfnmadd231ss_fma(ZEXT416((uint)(fVar145 * (fVar116 + fVar116))),
                                             ZEXT416((uint)fVar116),ZEXT416((uint)fVar116));
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),auVar130,
                                            ZEXT416((uint)(fVar116 * -2.0)));
                  fVar145 = auVar102._0_4_ * 0.5;
                  fVar116 = auVar17._0_4_ * 0.5;
                  auVar173._0_4_ = fVar116 * (float)local_4c0._0_4_;
                  auVar173._4_4_ = fVar116 * (float)local_4c0._4_4_;
                  auVar173._8_4_ = fVar116 * fStack_4b8;
                  auVar173._12_4_ = fVar116 * fStack_4b4;
                  auVar152._4_4_ = fVar145;
                  auVar152._0_4_ = fVar145;
                  auVar152._8_4_ = fVar145;
                  auVar152._12_4_ = fVar145;
                  auVar102 = vfmadd132ps_fma(auVar152,auVar173,local_4a0._0_16_);
                  fVar145 = auVar101._0_4_ * 0.5;
                  auVar174._4_4_ = fVar145;
                  auVar174._0_4_ = fVar145;
                  auVar174._8_4_ = fVar145;
                  auVar174._12_4_ = fVar145;
                  auVar102 = vfmadd132ps_fma(auVar174,auVar102,local_620._0_16_);
                  local_710.context = context->user;
                  fVar145 = auVar99._0_4_ * 0.5;
                  auVar153._4_4_ = fVar145;
                  auVar153._0_4_ = fVar145;
                  auVar153._8_4_ = fVar145;
                  auVar153._12_4_ = fVar145;
                  auVar101 = vfmadd132ps_fma(auVar153,auVar102,auVar205);
                  local_410 = auVar101._0_4_;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  auVar102 = vshufps_avx(auVar101,auVar101,0x55);
                  local_400 = auVar102;
                  local_3f0 = vshufps_avx(auVar101,auVar101,0xaa);
                  local_3e0 = auVar130;
                  uStack_3cc = local_3d0;
                  uStack_3c8 = local_3d0;
                  uStack_3c4 = local_3d0;
                  local_3c0 = local_600;
                  uStack_3b8 = uStack_5f8;
                  local_3b0 = local_800;
                  vpcmpeqd_avx2(ZEXT1632(local_800),ZEXT1632(local_800));
                  uStack_39c = (local_710.context)->instID[0];
                  local_3a0 = uStack_39c;
                  uStack_398 = uStack_39c;
                  uStack_394 = uStack_39c;
                  uStack_390 = (local_710.context)->instPrimID[0];
                  uStack_38c = uStack_390;
                  uStack_388 = uStack_390;
                  uStack_384 = uStack_390;
                  local_7d0 = local_4e0._0_8_;
                  uStack_7c8 = local_4e0._8_8_;
                  local_710.valid = (int *)&local_7d0;
                  local_710.geometryUserPtr = pGVar13->userPtr;
                  local_710.hit = (RTCHitN *)&local_410;
                  local_710.N = 4;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar13->intersectionFilterN)(&local_710);
                    auVar210._8_56_ = extraout_var;
                    auVar210._0_8_ = extraout_XMM1_Qa;
                    auVar130 = auVar210._0_16_;
                    auVar224 = ZEXT3264(_local_640);
                    auVar203 = ZEXT3264(local_6e0);
                    auVar231 = ZEXT3264(local_7a0);
                    auVar219 = ZEXT3264(local_780);
                    auVar210 = ZEXT3264(local_5e0);
                    auVar215 = ZEXT3264(local_760);
                    fVar227 = (float)local_7c0;
                    fVar232 = local_7c0._4_4_;
                    fVar115 = (float)uStack_7b8;
                    fVar117 = uStack_7b8._4_4_;
                    fVar119 = (float)uStack_7b0;
                    fVar238 = uStack_7b0._4_4_;
                    fVar239 = (float)uStack_7a8;
                  }
                  auVar78._8_8_ = uStack_7c8;
                  auVar78._0_8_ = local_7d0;
                  if (auVar78 == (undefined1  [16])0x0) {
                    auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar101 = vpcmpeqd_avx(auVar130,auVar130);
                    auVar102 = auVar102 ^ auVar101;
                    auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                                  CONCAT424(fStack_6a8,
                                                            CONCAT420(fStack_6ac,
                                                                      CONCAT416(fStack_6b0,
                                                                                CONCAT412(fStack_6b4
                                                                                          ,CONCAT48(
                                                  fStack_6b8,CONCAT44(fStack_6bc,local_6c0))))))));
                    auVar193 = ZEXT3264(local_6a0);
                  }
                  else {
                    p_Var14 = context->args->filter;
                    auVar101 = vpcmpeqd_avx(auVar102,auVar102);
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_710);
                      auVar224 = ZEXT3264(_local_640);
                      auVar203 = ZEXT3264(local_6e0);
                      auVar231 = ZEXT3264(local_7a0);
                      auVar219 = ZEXT3264(local_780);
                      auVar210 = ZEXT3264(local_5e0);
                      auVar215 = ZEXT3264(local_760);
                      auVar101 = vpcmpeqd_avx(auVar101,auVar101);
                      fVar227 = (float)local_7c0;
                      fVar232 = local_7c0._4_4_;
                      fVar115 = (float)uStack_7b8;
                      fVar117 = uStack_7b8._4_4_;
                      fVar119 = (float)uStack_7b0;
                      fVar238 = uStack_7b0._4_4_;
                      fVar239 = (float)uStack_7a8;
                    }
                    auVar79._8_8_ = uStack_7c8;
                    auVar79._0_8_ = local_7d0;
                    auVar17 = vpcmpeqd_avx(auVar79,_DAT_01feba10);
                    auVar102 = auVar17 ^ auVar101;
                    auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                                  CONCAT424(fStack_6a8,
                                                            CONCAT420(fStack_6ac,
                                                                      CONCAT416(fStack_6b0,
                                                                                CONCAT412(fStack_6b4
                                                                                          ,CONCAT48(
                                                  fStack_6b8,CONCAT44(fStack_6bc,local_6c0))))))));
                    auVar193 = ZEXT3264(local_6a0);
                    if (auVar79 != (undefined1  [16])0x0) {
                      auVar17 = auVar17 ^ auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])local_710.hit);
                      *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x10)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x20)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x30)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x40)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x50)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x60)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x70)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar101;
                      auVar101 = vmaskmovps_avx(auVar17,*(undefined1 (*) [16])(local_710.hit + 0x80)
                                               );
                      *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar101;
                    }
                  }
                  auVar131._8_8_ = 0x100000001;
                  auVar131._0_8_ = 0x100000001;
                  if ((auVar131 & auVar102) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar94;
                  }
                  *(undefined4 *)(local_5a0 + uVar89 * 4) = 0;
                  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar114._4_4_ = uVar94;
                  auVar114._0_4_ = uVar94;
                  auVar114._8_4_ = uVar94;
                  auVar114._12_4_ = uVar94;
                  auVar114._16_4_ = uVar94;
                  auVar114._20_4_ = uVar94;
                  auVar114._24_4_ = uVar94;
                  auVar114._28_4_ = uVar94;
                  auVar206 = vcmpps_avx(auVar210._0_32_,auVar114,2);
                  auVar158 = vandps_avx(auVar206,local_5a0);
                  auVar206 = local_5a0 & auVar206;
                  bVar70 = (auVar206 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar71 = (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar69 = (auVar206 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar68 = SUB321(auVar206 >> 0x7f,0) != '\0';
                  bVar67 = (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar66 = SUB321(auVar206 >> 0xbf,0) != '\0';
                  bVar65 = (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar64 = auVar206[0x1f] < '\0';
                  if (((((((bVar70 || bVar71) || bVar69) || bVar68) || bVar67) || bVar66) || bVar65)
                      || bVar64) {
                    auVar143._8_4_ = 0x7f800000;
                    auVar143._0_8_ = 0x7f8000007f800000;
                    auVar143._12_4_ = 0x7f800000;
                    auVar143._16_4_ = 0x7f800000;
                    auVar143._20_4_ = 0x7f800000;
                    auVar143._24_4_ = 0x7f800000;
                    auVar143._28_4_ = 0x7f800000;
                    auVar206 = vblendvps_avx(auVar143,auVar210._0_32_,auVar158);
                    auVar111 = vshufps_avx(auVar206,auVar206,0xb1);
                    auVar111 = vminps_avx(auVar206,auVar111);
                    auVar137 = vshufpd_avx(auVar111,auVar111,5);
                    auVar111 = vminps_avx(auVar111,auVar137);
                    auVar137 = vpermpd_avx2(auVar111,0x4e);
                    local_5a0 = vminps_avx(auVar111,auVar137);
                    auVar111 = vcmpps_avx(auVar206,local_5a0,0);
                    auVar137 = auVar158 & auVar111;
                    auVar206 = auVar158;
                    if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar137 >> 0x7f,0) != '\0') ||
                          (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar137 >> 0xbf,0) != '\0') ||
                        (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar137[0x1f] < '\0') {
                      auVar206 = vandps_avx(auVar111,auVar158);
                    }
                    uVar88 = vmovmskps_avx(auVar206);
                    uVar90 = 0;
                    for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                      uVar90 = uVar90 + 1;
                    }
                    uVar89 = (ulong)uVar90;
                  }
                  auVar160 = ZEXT3264(local_5a0);
                  local_5a0 = auVar158;
                } while (((((((bVar70 || bVar71) || bVar69) || bVar68) || bVar67) || bVar66) ||
                         bVar65) || bVar64);
              }
            }
          }
          auVar144 = ZEXT3264(local_660);
        }
      }
      if (8 < iVar12) {
        _local_640 = auVar224._0_32_;
        local_500._4_4_ = iVar12;
        local_500._0_4_ = iVar12;
        fStack_4f8 = (float)iVar12;
        fStack_4f4 = (float)iVar12;
        fStack_4f0 = (float)iVar12;
        fStack_4ec = (float)iVar12;
        fStack_4e8 = (float)iVar12;
        iStack_4e4 = iVar12;
        local_140 = fVar146;
        fStack_13c = fVar146;
        fStack_138 = fVar146;
        fStack_134 = fVar146;
        fStack_130 = fVar146;
        fStack_12c = fVar146;
        fStack_128 = fVar146;
        fStack_124 = fVar146;
        local_160 = local_540._0_4_;
        uStack_15c = local_540._0_4_;
        uStack_158 = local_540._0_4_;
        uStack_154 = local_540._0_4_;
        uStack_150 = local_540._0_4_;
        uStack_14c = local_540._0_4_;
        uStack_148 = local_540._0_4_;
        uStack_144 = local_540._0_4_;
        local_180 = 1.0 / (float)local_520._0_4_;
        fStack_17c = local_180;
        fStack_178 = local_180;
        fStack_174 = local_180;
        fStack_170 = local_180;
        fStack_16c = local_180;
        fStack_168 = local_180;
        fStack_164 = local_180;
        local_1d0 = uVar87;
        uStack_1cc = uVar87;
        uStack_1c8 = uVar87;
        uStack_1c4 = uVar87;
        local_1e0 = uVar11;
        uStack_1dc = uVar11;
        uStack_1d8 = uVar11;
        uStack_1d4 = uVar11;
        lVar93 = 8;
        local_760 = auVar215._0_32_;
        local_5e0 = auVar210._0_32_;
        do {
          auVar158 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar93 * 4 + lVar21);
          auVar206 = *(undefined1 (*) [32])(lVar21 + 0x22307f0 + lVar93 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar21 + 0x2230c74 + lVar93 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar21 + 0x22310f8 + lVar93 * 4);
          auVar86 = *pauVar5;
          auVar225._0_4_ = auVar197._0_4_ * *(float *)*pauVar5;
          auVar225._4_4_ = auVar197._4_4_ * *(float *)(*pauVar5 + 4);
          auVar225._8_4_ = auVar197._8_4_ * *(float *)(*pauVar5 + 8);
          auVar225._12_4_ = auVar197._12_4_ * *(float *)(*pauVar5 + 0xc);
          auVar225._16_4_ = auVar197._16_4_ * *(float *)(*pauVar5 + 0x10);
          auVar225._20_4_ = auVar197._20_4_ * *(float *)(*pauVar5 + 0x14);
          auVar225._28_36_ = auVar224._28_36_;
          auVar225._24_4_ = auVar197._24_4_ * *(float *)(*pauVar5 + 0x18);
          auVar224._0_4_ = fVar227 * *(float *)*pauVar5;
          auVar224._4_4_ = fVar232 * *(float *)(*pauVar5 + 4);
          auVar224._8_4_ = fVar115 * *(float *)(*pauVar5 + 8);
          auVar224._12_4_ = fVar117 * *(float *)(*pauVar5 + 0xc);
          auVar224._16_4_ = fVar119 * *(float *)(*pauVar5 + 0x10);
          auVar224._20_4_ = fVar238 * *(float *)(*pauVar5 + 0x14);
          auVar224._28_36_ = auVar160._28_36_;
          auVar224._24_4_ = fVar239 * *(float *)(*pauVar5 + 0x18);
          auVar205 = vfmadd231ps_fma(auVar225._0_32_,auVar111,auVar219._0_32_);
          auVar102 = vfmadd231ps_fma(auVar224._0_32_,auVar111,auVar231._0_32_);
          auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),auVar206,auVar203._0_32_);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar206,auVar144._0_32_);
          auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),auVar158,auVar193._0_32_);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar158,local_5c0);
          auVar137 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar93 * 4 + lVar21);
          auVar191 = *(undefined1 (*) [32])(lVar21 + 0x2232c10 + lVar93 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar21 + 0x2233094 + lVar93 * 4);
          pfVar6 = (float *)(lVar21 + 0x2233518 + lVar93 * 4);
          fVar116 = *pfVar6;
          fVar118 = pfVar6[1];
          fVar120 = pfVar6[2];
          fVar121 = pfVar6[3];
          fVar122 = pfVar6[4];
          fVar123 = pfVar6[5];
          fVar72 = pfVar6[6];
          auVar36._4_4_ = auVar197._4_4_ * fVar118;
          auVar36._0_4_ = auVar197._0_4_ * fVar116;
          auVar36._8_4_ = auVar197._8_4_ * fVar120;
          auVar36._12_4_ = auVar197._12_4_ * fVar121;
          auVar36._16_4_ = auVar197._16_4_ * fVar122;
          auVar36._20_4_ = auVar197._20_4_ * fVar123;
          auVar36._24_4_ = auVar197._24_4_ * fVar72;
          auVar36._28_4_ = local_5c0._28_4_;
          auVar198._0_4_ = fVar227 * fVar116;
          auVar198._4_4_ = fVar232 * fVar118;
          auVar198._8_4_ = fVar115 * fVar120;
          auVar198._12_4_ = fVar117 * fVar121;
          auVar198._16_4_ = fVar119 * fVar122;
          auVar198._20_4_ = fVar238 * fVar123;
          auVar198._28_36_ = auVar197._28_36_;
          auVar198._24_4_ = fVar239 * fVar72;
          auVar101 = vfmadd231ps_fma(auVar36,auVar103,auVar219._0_32_);
          auVar17 = vfmadd231ps_fma(auVar198._0_32_,auVar103,auVar231._0_32_);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar191,auVar203._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar191,auVar144._0_32_);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar137,auVar193._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar137,local_5c0);
          local_4a0 = ZEXT1632(auVar101);
          _local_4c0 = ZEXT1632(auVar205);
          auVar9 = vsubps_avx(local_4a0,_local_4c0);
          auVar114 = ZEXT1632(auVar17);
          local_540 = ZEXT1632(auVar102);
          local_4e0 = vsubps_avx(auVar114,local_540);
          auVar37._4_4_ = auVar102._4_4_ * auVar9._4_4_;
          auVar37._0_4_ = auVar102._0_4_ * auVar9._0_4_;
          auVar37._8_4_ = auVar102._8_4_ * auVar9._8_4_;
          auVar37._12_4_ = auVar102._12_4_ * auVar9._12_4_;
          auVar37._16_4_ = auVar9._16_4_ * 0.0;
          auVar37._20_4_ = auVar9._20_4_ * 0.0;
          auVar37._24_4_ = auVar9._24_4_ * 0.0;
          auVar37._28_4_ = auVar137._28_4_;
          fVar146 = local_4e0._0_4_;
          auVar160._0_4_ = auVar205._0_4_ * fVar146;
          fVar115 = local_4e0._4_4_;
          auVar160._4_4_ = auVar205._4_4_ * fVar115;
          fVar117 = local_4e0._8_4_;
          auVar160._8_4_ = auVar205._8_4_ * fVar117;
          fVar119 = local_4e0._12_4_;
          auVar160._12_4_ = auVar205._12_4_ * fVar119;
          fVar238 = local_4e0._16_4_;
          auVar160._16_4_ = fVar238 * 0.0;
          fVar239 = local_4e0._20_4_;
          auVar160._20_4_ = fVar239 * 0.0;
          fVar145 = local_4e0._24_4_;
          auVar160._28_36_ = auVar144._28_36_;
          auVar160._24_4_ = fVar145 * 0.0;
          auVar224 = ZEXT3264(auVar111);
          auVar181 = vsubps_avx(auVar37,auVar160._0_32_);
          local_840 = auVar86._0_4_;
          fStack_83c = auVar86._4_4_;
          fStack_838 = auVar86._8_4_;
          fStack_834 = auVar86._12_4_;
          fStack_830 = auVar86._16_4_;
          fStack_82c = auVar86._20_4_;
          fStack_828 = auVar86._24_4_;
          auVar157._0_4_ = (float)local_e0 * local_840;
          auVar157._4_4_ = local_e0._4_4_ * fStack_83c;
          auVar157._8_4_ = (float)uStack_d8 * fStack_838;
          auVar157._12_4_ = uStack_d8._4_4_ * fStack_834;
          auVar157._16_4_ = (float)uStack_d0 * fStack_830;
          auVar157._20_4_ = uStack_d0._4_4_ * fStack_82c;
          auVar157._24_4_ = (float)uStack_c8 * fStack_828;
          auVar157._28_4_ = 0;
          auVar205 = vfmadd231ps_fma(auVar157,auVar111,local_c0);
          auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),auVar206,local_a0);
          auVar205 = vfmadd231ps_fma(ZEXT1632(auVar205),local_80,auVar158);
          auVar160 = ZEXT1664(auVar205);
          auVar38._4_4_ = local_e0._4_4_ * fVar118;
          auVar38._0_4_ = (float)local_e0 * fVar116;
          auVar38._8_4_ = (float)uStack_d8 * fVar120;
          auVar38._12_4_ = uStack_d8._4_4_ * fVar121;
          auVar38._16_4_ = (float)uStack_d0 * fVar122;
          auVar38._20_4_ = uStack_d0._4_4_ * fVar123;
          auVar38._24_4_ = (float)uStack_c8 * fVar72;
          auVar38._28_4_ = uStack_c8._4_4_;
          auVar102 = vfmadd231ps_fma(auVar38,auVar103,local_c0);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar191,local_a0);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar137,local_80);
          auVar39._4_4_ = fVar115 * fVar115;
          auVar39._0_4_ = fVar146 * fVar146;
          auVar39._8_4_ = fVar117 * fVar117;
          auVar39._12_4_ = fVar119 * fVar119;
          auVar39._16_4_ = fVar238 * fVar238;
          auVar39._20_4_ = fVar239 * fVar239;
          auVar39._24_4_ = fVar145 * fVar145;
          auVar39._28_4_ = local_80._28_4_;
          auVar101 = vfmadd231ps_fma(auVar39,auVar9,auVar9);
          auVar139 = ZEXT1632(auVar102);
          auVar187 = vmaxps_avx(ZEXT1632(auVar205),auVar139);
          auVar207._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar101._0_4_;
          auVar207._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar101._4_4_;
          auVar207._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar101._8_4_;
          auVar207._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar101._12_4_;
          auVar207._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
          auVar207._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
          auVar207._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
          auVar207._28_4_ = 0;
          auVar40._4_4_ = auVar181._4_4_ * auVar181._4_4_;
          auVar40._0_4_ = auVar181._0_4_ * auVar181._0_4_;
          auVar40._8_4_ = auVar181._8_4_ * auVar181._8_4_;
          auVar40._12_4_ = auVar181._12_4_ * auVar181._12_4_;
          auVar40._16_4_ = auVar181._16_4_ * auVar181._16_4_;
          auVar40._20_4_ = auVar181._20_4_ * auVar181._20_4_;
          auVar40._24_4_ = auVar181._24_4_ * auVar181._24_4_;
          auVar40._28_4_ = pfVar6[7];
          auVar187 = vcmpps_avx(auVar40,auVar207,2);
          local_320 = (int)lVar93;
          auVar208._4_4_ = local_320;
          auVar208._0_4_ = local_320;
          auVar208._8_4_ = local_320;
          auVar208._12_4_ = local_320;
          auVar208._16_4_ = local_320;
          auVar208._20_4_ = local_320;
          auVar208._24_4_ = local_320;
          auVar208._28_4_ = local_320;
          auVar181 = vpor_avx2(auVar208,_DAT_0205a920);
          auVar112 = vpcmpgtd_avx2(_local_500,auVar181);
          auVar181 = auVar112 & auVar187;
          fVar227 = (float)local_7c0;
          fVar232 = local_7c0._4_4_;
          fVar115 = (float)uStack_7b8;
          fVar117 = uStack_7b8._4_4_;
          fVar119 = (float)uStack_7b0;
          fVar238 = uStack_7b0._4_4_;
          fVar239 = (float)uStack_7a8;
          if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar181 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar181 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar181 >> 0x7f,0) == '\0') &&
                (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar181 >> 0xbf,0) == '\0') &&
              (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar181[0x1f]) {
LAB_016c90dc:
            auVar231 = ZEXT3264(local_7a0);
            auVar219 = ZEXT3264(local_780);
            auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                          CONCAT424(fStack_6a8,
                                                    CONCAT420(fStack_6ac,
                                                              CONCAT416(fStack_6b0,
                                                                        CONCAT412(fStack_6b4,
                                                                                  CONCAT48(
                                                  fStack_6b8,CONCAT44(fStack_6bc,local_6c0))))))));
            auVar203 = ZEXT3264(local_6e0);
            auVar193 = ZEXT3264(local_6a0);
          }
          else {
            local_200 = vandps_avx(auVar112,auVar187);
            auVar41._4_4_ = (float)local_640._4_4_ * fVar118;
            auVar41._0_4_ = (float)local_640._0_4_ * fVar116;
            auVar41._8_4_ = fStack_638 * fVar120;
            auVar41._12_4_ = fStack_634 * fVar121;
            auVar41._16_4_ = fStack_630 * fVar122;
            auVar41._20_4_ = fStack_62c * fVar123;
            auVar41._24_4_ = fStack_628 * fVar72;
            auVar41._28_4_ = auVar187._28_4_;
            auVar102 = vfmadd213ps_fma(auVar103,local_1a0,auVar41);
            auVar102 = vfmadd213ps_fma(auVar191,local_460,ZEXT1632(auVar102));
            auVar102 = vfmadd132ps_fma(auVar137,ZEXT1632(auVar102),local_480);
            local_100 = ZEXT1632(auVar102);
            auVar42._4_4_ = (float)local_640._4_4_ * fStack_83c;
            auVar42._0_4_ = (float)local_640._0_4_ * local_840;
            auVar42._8_4_ = fStack_638 * fStack_838;
            auVar42._12_4_ = fStack_634 * fStack_834;
            auVar42._16_4_ = fStack_630 * fStack_830;
            auVar42._20_4_ = fStack_62c * fStack_82c;
            auVar42._24_4_ = fStack_628 * fStack_828;
            auVar42._28_4_ = auVar187._28_4_;
            auVar102 = vfmadd213ps_fma(auVar111,local_1a0,auVar42);
            auVar102 = vfmadd213ps_fma(auVar206,local_460,ZEXT1632(auVar102));
            auVar206 = *(undefined1 (*) [32])(lVar21 + 0x223157c + lVar93 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar21 + 0x2231a00 + lVar93 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar21 + 0x2231e84 + lVar93 * 4);
            pfVar6 = (float *)(lVar21 + 0x2232308 + lVar93 * 4);
            fVar146 = *pfVar6;
            fVar145 = pfVar6[1];
            fVar116 = pfVar6[2];
            fVar118 = pfVar6[3];
            fVar120 = pfVar6[4];
            fVar121 = pfVar6[5];
            fVar122 = pfVar6[6];
            auVar201._0_4_ = local_6c0 * fVar146;
            auVar201._4_4_ = fStack_6bc * fVar145;
            auVar201._8_4_ = fStack_6b8 * fVar116;
            auVar201._12_4_ = fStack_6b4 * fVar118;
            auVar201._16_4_ = fStack_6b0 * fVar120;
            auVar201._20_4_ = fStack_6ac * fVar121;
            auVar201._24_4_ = fStack_6a8 * fVar122;
            auVar201._28_4_ = 0;
            auVar222._0_4_ = (float)local_7c0 * fVar146;
            auVar222._4_4_ = local_7c0._4_4_ * fVar145;
            auVar222._8_4_ = (float)uStack_7b8 * fVar116;
            auVar222._12_4_ = uStack_7b8._4_4_ * fVar118;
            auVar222._16_4_ = (float)uStack_7b0 * fVar120;
            auVar222._20_4_ = uStack_7b0._4_4_ * fVar121;
            auVar222._24_4_ = (float)uStack_7a8 * fVar122;
            auVar222._28_4_ = 0;
            auVar43._4_4_ = fVar145 * (float)local_640._4_4_;
            auVar43._0_4_ = fVar146 * (float)local_640._0_4_;
            auVar43._8_4_ = fVar116 * fStack_638;
            auVar43._12_4_ = fVar118 * fStack_634;
            auVar43._16_4_ = fVar120 * fStack_630;
            auVar43._20_4_ = fVar121 * fStack_62c;
            auVar43._24_4_ = fVar122 * fStack_628;
            auVar43._28_4_ = pfVar6[7];
            auVar101 = vfmadd231ps_fma(auVar201,auVar137,local_780);
            auVar17 = vfmadd231ps_fma(auVar222,auVar137,local_7a0);
            auVar99 = vfmadd231ps_fma(auVar43,local_1a0,auVar137);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar111,local_6e0);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar111,local_660);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_460,auVar111);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar206,local_6a0);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar206,local_5c0);
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_480,auVar206);
            pfVar6 = (float *)(lVar21 + 0x2234728 + lVar93 * 4);
            fVar146 = *pfVar6;
            fVar145 = pfVar6[1];
            fVar116 = pfVar6[2];
            fVar118 = pfVar6[3];
            fVar120 = pfVar6[4];
            fVar121 = pfVar6[5];
            fVar122 = pfVar6[6];
            auVar44._4_4_ = fStack_6bc * fVar145;
            auVar44._0_4_ = local_6c0 * fVar146;
            auVar44._8_4_ = fStack_6b8 * fVar116;
            auVar44._12_4_ = fStack_6b4 * fVar118;
            auVar44._16_4_ = fStack_6b0 * fVar120;
            auVar44._20_4_ = fStack_6ac * fVar121;
            auVar44._24_4_ = fStack_6a8 * fVar122;
            auVar44._28_4_ = fStack_6a4;
            auVar45._4_4_ = local_7c0._4_4_ * fVar145;
            auVar45._0_4_ = (float)local_7c0 * fVar146;
            auVar45._8_4_ = (float)uStack_7b8 * fVar116;
            auVar45._12_4_ = uStack_7b8._4_4_ * fVar118;
            auVar45._16_4_ = (float)uStack_7b0 * fVar120;
            auVar45._20_4_ = uStack_7b0._4_4_ * fVar121;
            auVar45._24_4_ = (float)uStack_7a8 * fVar122;
            auVar45._28_4_ = uStack_7a8._4_4_;
            auVar46._4_4_ = fVar145 * (float)local_640._4_4_;
            auVar46._0_4_ = fVar146 * (float)local_640._0_4_;
            auVar46._8_4_ = fVar116 * fStack_638;
            auVar46._12_4_ = fVar118 * fStack_634;
            auVar46._16_4_ = fVar120 * fStack_630;
            auVar46._20_4_ = fVar121 * fStack_62c;
            auVar46._24_4_ = fVar122 * fStack_628;
            auVar46._28_4_ = pfVar6[7];
            auVar206 = *(undefined1 (*) [32])(lVar21 + 0x22342a4 + lVar93 * 4);
            auVar98 = vfmadd231ps_fma(auVar44,auVar206,local_780);
            auVar147 = vfmadd231ps_fma(auVar45,auVar206,local_7a0);
            auVar125 = vfmadd231ps_fma(auVar46,local_1a0,auVar206);
            auVar206 = *(undefined1 (*) [32])(lVar21 + 0x2233e20 + lVar93 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar206,local_6e0);
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar206,local_660);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_460,auVar206);
            auVar206 = *(undefined1 (*) [32])(lVar21 + 0x223399c + lVar93 * 4);
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar206,local_6a0);
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar206,local_5c0);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_480,auVar206);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar209._16_4_ = 0x7fffffff;
            auVar209._20_4_ = 0x7fffffff;
            auVar209._24_4_ = 0x7fffffff;
            auVar209._28_4_ = 0x7fffffff;
            auVar206 = vandps_avx(ZEXT1632(auVar101),auVar209);
            auVar111 = vandps_avx(ZEXT1632(auVar17),auVar209);
            auVar111 = vmaxps_avx(auVar206,auVar111);
            auVar206 = vandps_avx(ZEXT1632(auVar99),auVar209);
            auVar206 = vmaxps_avx(auVar111,auVar206);
            auVar85._4_4_ = fStack_13c;
            auVar85._0_4_ = local_140;
            auVar85._8_4_ = fStack_138;
            auVar85._12_4_ = fStack_134;
            auVar85._16_4_ = fStack_130;
            auVar85._20_4_ = fStack_12c;
            auVar85._24_4_ = fStack_128;
            auVar85._28_4_ = fStack_124;
            auVar206 = vcmpps_avx(auVar206,auVar85,1);
            auVar137 = vblendvps_avx(ZEXT1632(auVar101),auVar9,auVar206);
            auVar191 = vblendvps_avx(ZEXT1632(auVar17),local_4e0,auVar206);
            auVar206 = vandps_avx(ZEXT1632(auVar98),auVar209);
            auVar111 = vandps_avx(ZEXT1632(auVar147),auVar209);
            auVar111 = vmaxps_avx(auVar206,auVar111);
            auVar206 = vandps_avx(auVar209,ZEXT1632(auVar125));
            auVar206 = vmaxps_avx(auVar111,auVar206);
            auVar111 = vcmpps_avx(auVar206,auVar85,1);
            auVar206 = vblendvps_avx(ZEXT1632(auVar98),auVar9,auVar111);
            auVar111 = vblendvps_avx(ZEXT1632(auVar147),local_4e0,auVar111);
            auVar102 = vfmadd213ps_fma(auVar158,local_480,ZEXT1632(auVar102));
            auVar101 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar191,auVar191);
            auVar158 = vrsqrtps_avx(ZEXT1632(auVar101));
            fVar146 = auVar158._0_4_;
            fVar145 = auVar158._4_4_;
            fVar116 = auVar158._8_4_;
            fVar118 = auVar158._12_4_;
            fVar120 = auVar158._16_4_;
            fVar121 = auVar158._20_4_;
            fVar122 = auVar158._24_4_;
            auVar47._4_4_ = fVar145 * fVar145 * fVar145 * auVar101._4_4_ * -0.5;
            auVar47._0_4_ = fVar146 * fVar146 * fVar146 * auVar101._0_4_ * -0.5;
            auVar47._8_4_ = fVar116 * fVar116 * fVar116 * auVar101._8_4_ * -0.5;
            auVar47._12_4_ = fVar118 * fVar118 * fVar118 * auVar101._12_4_ * -0.5;
            auVar47._16_4_ = fVar120 * fVar120 * fVar120 * -0.0;
            auVar47._20_4_ = fVar121 * fVar121 * fVar121 * -0.0;
            auVar47._24_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar47._28_4_ = 0;
            auVar176._8_4_ = 0x3fc00000;
            auVar176._0_8_ = 0x3fc000003fc00000;
            auVar176._12_4_ = 0x3fc00000;
            auVar176._16_4_ = 0x3fc00000;
            auVar176._20_4_ = 0x3fc00000;
            auVar176._24_4_ = 0x3fc00000;
            auVar176._28_4_ = 0x3fc00000;
            auVar101 = vfmadd231ps_fma(auVar47,auVar176,auVar158);
            fVar146 = auVar101._0_4_;
            fVar145 = auVar101._4_4_;
            auVar48._4_4_ = auVar191._4_4_ * fVar145;
            auVar48._0_4_ = auVar191._0_4_ * fVar146;
            fVar116 = auVar101._8_4_;
            auVar48._8_4_ = auVar191._8_4_ * fVar116;
            fVar118 = auVar101._12_4_;
            auVar48._12_4_ = auVar191._12_4_ * fVar118;
            auVar48._16_4_ = auVar191._16_4_ * 0.0;
            auVar48._20_4_ = auVar191._20_4_ * 0.0;
            auVar48._24_4_ = auVar191._24_4_ * 0.0;
            auVar48._28_4_ = auVar158._28_4_;
            auVar49._4_4_ = fVar145 * -auVar137._4_4_;
            auVar49._0_4_ = fVar146 * -auVar137._0_4_;
            auVar49._8_4_ = fVar116 * -auVar137._8_4_;
            auVar49._12_4_ = fVar118 * -auVar137._12_4_;
            auVar49._16_4_ = -auVar137._16_4_ * 0.0;
            auVar49._20_4_ = -auVar137._20_4_ * 0.0;
            auVar49._24_4_ = -auVar137._24_4_ * 0.0;
            auVar49._28_4_ = auVar191._28_4_;
            auVar101 = vfmadd213ps_fma(auVar206,auVar206,ZEXT832(0) << 0x20);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar111,auVar111);
            auVar158 = vrsqrtps_avx(ZEXT1632(auVar101));
            auVar137 = ZEXT1632(CONCAT412(fVar118 * 0.0,
                                          CONCAT48(fVar116 * 0.0,
                                                   CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            fVar146 = auVar158._0_4_;
            fVar145 = auVar158._4_4_;
            fVar116 = auVar158._8_4_;
            fVar118 = auVar158._12_4_;
            fVar120 = auVar158._16_4_;
            fVar121 = auVar158._20_4_;
            fVar122 = auVar158._24_4_;
            auVar50._4_4_ = fVar145 * fVar145 * fVar145 * auVar101._4_4_ * -0.5;
            auVar50._0_4_ = fVar146 * fVar146 * fVar146 * auVar101._0_4_ * -0.5;
            auVar50._8_4_ = fVar116 * fVar116 * fVar116 * auVar101._8_4_ * -0.5;
            auVar50._12_4_ = fVar118 * fVar118 * fVar118 * auVar101._12_4_ * -0.5;
            auVar50._16_4_ = fVar120 * fVar120 * fVar120 * -0.0;
            auVar50._20_4_ = fVar121 * fVar121 * fVar121 * -0.0;
            auVar50._24_4_ = fVar122 * fVar122 * fVar122 * -0.0;
            auVar50._28_4_ = 0;
            auVar101 = vfmadd231ps_fma(auVar50,auVar176,auVar158);
            fVar146 = auVar101._0_4_;
            fVar145 = auVar101._4_4_;
            auVar51._4_4_ = auVar111._4_4_ * fVar145;
            auVar51._0_4_ = auVar111._0_4_ * fVar146;
            fVar116 = auVar101._8_4_;
            auVar51._8_4_ = auVar111._8_4_ * fVar116;
            fVar118 = auVar101._12_4_;
            auVar51._12_4_ = auVar111._12_4_ * fVar118;
            auVar51._16_4_ = auVar111._16_4_ * 0.0;
            auVar51._20_4_ = auVar111._20_4_ * 0.0;
            auVar51._24_4_ = auVar111._24_4_ * 0.0;
            auVar51._28_4_ = 0;
            auVar52._4_4_ = fVar145 * -auVar206._4_4_;
            auVar52._0_4_ = fVar146 * -auVar206._0_4_;
            auVar52._8_4_ = fVar116 * -auVar206._8_4_;
            auVar52._12_4_ = fVar118 * -auVar206._12_4_;
            auVar52._16_4_ = -auVar206._16_4_ * 0.0;
            auVar52._20_4_ = -auVar206._20_4_ * 0.0;
            auVar52._24_4_ = -auVar206._24_4_ * 0.0;
            auVar52._28_4_ = auVar158._28_4_;
            auVar53._28_4_ = 0xbf000000;
            auVar53._0_28_ =
                 ZEXT1628(CONCAT412(fVar118 * 0.0,
                                    CONCAT48(fVar116 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            auVar101 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar205),_local_4c0);
            auVar158 = ZEXT1632(auVar205);
            auVar17 = vfmadd213ps_fma(auVar49,auVar158,local_540);
            auVar99 = vfmadd213ps_fma(auVar137,auVar158,ZEXT1632(auVar102));
            auVar126 = vfnmadd213ps_fma(auVar48,auVar158,_local_4c0);
            auVar98 = vfmadd213ps_fma(auVar51,auVar139,local_4a0);
            auVar161 = vfnmadd213ps_fma(auVar49,auVar158,local_540);
            auVar147 = vfmadd213ps_fma(auVar52,auVar139,auVar114);
            auVar104 = ZEXT1632(auVar205);
            auVar102 = vfnmadd231ps_fma(ZEXT1632(auVar102),auVar104,auVar137);
            auVar125 = vfmadd213ps_fma(auVar53,auVar139,local_100);
            auVar169 = vfnmadd213ps_fma(auVar51,auVar139,local_4a0);
            auVar96 = vfnmadd213ps_fma(auVar52,auVar139,auVar114);
            auVar124 = vfnmadd231ps_fma(local_100,auVar139,auVar53);
            auVar158 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar161));
            auVar206 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar102));
            auVar54._4_4_ = auVar158._4_4_ * auVar102._4_4_;
            auVar54._0_4_ = auVar158._0_4_ * auVar102._0_4_;
            auVar54._8_4_ = auVar158._8_4_ * auVar102._8_4_;
            auVar54._12_4_ = auVar158._12_4_ * auVar102._12_4_;
            auVar54._16_4_ = auVar158._16_4_ * 0.0;
            auVar54._20_4_ = auVar158._20_4_ * 0.0;
            auVar54._24_4_ = auVar158._24_4_ * 0.0;
            auVar54._28_4_ = 0;
            auVar97 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar161),auVar206);
            auVar55._4_4_ = auVar126._4_4_ * auVar206._4_4_;
            auVar55._0_4_ = auVar126._0_4_ * auVar206._0_4_;
            auVar55._8_4_ = auVar126._8_4_ * auVar206._8_4_;
            auVar55._12_4_ = auVar126._12_4_ * auVar206._12_4_;
            auVar55._16_4_ = auVar206._16_4_ * 0.0;
            auVar55._20_4_ = auVar206._20_4_ * 0.0;
            auVar55._24_4_ = auVar206._24_4_ * 0.0;
            auVar55._28_4_ = auVar206._28_4_;
            auVar187 = ZEXT1632(auVar126);
            auVar206 = vsubps_avx(ZEXT1632(auVar98),auVar187);
            auVar112 = ZEXT1632(auVar102);
            auVar102 = vfmsub231ps_fma(auVar55,auVar112,auVar206);
            auVar56._4_4_ = auVar161._4_4_ * auVar206._4_4_;
            auVar56._0_4_ = auVar161._0_4_ * auVar206._0_4_;
            auVar56._8_4_ = auVar161._8_4_ * auVar206._8_4_;
            auVar56._12_4_ = auVar161._12_4_ * auVar206._12_4_;
            auVar56._16_4_ = auVar206._16_4_ * 0.0;
            auVar56._20_4_ = auVar206._20_4_ * 0.0;
            auVar56._24_4_ = auVar206._24_4_ * 0.0;
            auVar56._28_4_ = auVar206._28_4_;
            auVar126 = vfmsub231ps_fma(auVar56,auVar187,auVar158);
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
            auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar97));
            auVar114 = vcmpps_avx(ZEXT1632(auVar102),ZEXT832(0) << 0x20,2);
            auVar158 = vblendvps_avx(ZEXT1632(auVar169),ZEXT1632(auVar101),auVar114);
            auVar206 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar17),auVar114);
            auVar111 = vblendvps_avx(ZEXT1632(auVar124),ZEXT1632(auVar99),auVar114);
            auVar137 = vblendvps_avx(auVar187,ZEXT1632(auVar98),auVar114);
            auVar191 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar147),auVar114);
            auVar103 = vblendvps_avx(auVar112,ZEXT1632(auVar125),auVar114);
            auVar187 = vblendvps_avx(ZEXT1632(auVar98),auVar187,auVar114);
            auVar181 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar161),auVar114);
            auVar102 = vpackssdw_avx(local_200._0_16_,local_200._16_16_);
            auVar112 = vblendvps_avx(ZEXT1632(auVar125),auVar112,auVar114);
            auVar187 = vsubps_avx(auVar187,auVar158);
            auVar98 = auVar187._0_16_;
            auVar181 = vsubps_avx(auVar181,auVar206);
            auVar105 = vsubps_avx(auVar112,auVar111);
            auVar224 = ZEXT3264(auVar105);
            auVar18 = vsubps_avx(auVar158,auVar137);
            auVar19 = vsubps_avx(auVar206,auVar191);
            auVar20 = vsubps_avx(auVar111,auVar103);
            auVar182._0_4_ = auVar105._0_4_ * auVar158._0_4_;
            auVar182._4_4_ = auVar105._4_4_ * auVar158._4_4_;
            auVar182._8_4_ = auVar105._8_4_ * auVar158._8_4_;
            auVar182._12_4_ = auVar105._12_4_ * auVar158._12_4_;
            auVar182._16_4_ = auVar105._16_4_ * auVar158._16_4_;
            auVar182._20_4_ = auVar105._20_4_ * auVar158._20_4_;
            auVar182._24_4_ = auVar105._24_4_ * auVar158._24_4_;
            auVar182._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar182,auVar111,auVar187);
            auVar57._4_4_ = auVar187._4_4_ * auVar206._4_4_;
            auVar57._0_4_ = auVar187._0_4_ * auVar206._0_4_;
            auVar57._8_4_ = auVar187._8_4_ * auVar206._8_4_;
            auVar57._12_4_ = auVar187._12_4_ * auVar206._12_4_;
            auVar57._16_4_ = auVar187._16_4_ * auVar206._16_4_;
            auVar57._20_4_ = auVar187._20_4_ * auVar206._20_4_;
            auVar57._24_4_ = auVar187._24_4_ * auVar206._24_4_;
            auVar57._28_4_ = auVar112._28_4_;
            auVar17 = vfmsub231ps_fma(auVar57,auVar158,auVar181);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar101));
            auVar183._0_4_ = auVar181._0_4_ * auVar111._0_4_;
            auVar183._4_4_ = auVar181._4_4_ * auVar111._4_4_;
            auVar183._8_4_ = auVar181._8_4_ * auVar111._8_4_;
            auVar183._12_4_ = auVar181._12_4_ * auVar111._12_4_;
            auVar183._16_4_ = auVar181._16_4_ * auVar111._16_4_;
            auVar183._20_4_ = auVar181._20_4_ * auVar111._20_4_;
            auVar183._24_4_ = auVar181._24_4_ * auVar111._24_4_;
            auVar183._28_4_ = 0;
            auVar17 = vfmsub231ps_fma(auVar183,auVar206,auVar105);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
            auVar160 = ZEXT1664(auVar17);
            auVar184._0_4_ = auVar20._0_4_ * auVar137._0_4_;
            auVar184._4_4_ = auVar20._4_4_ * auVar137._4_4_;
            auVar184._8_4_ = auVar20._8_4_ * auVar137._8_4_;
            auVar184._12_4_ = auVar20._12_4_ * auVar137._12_4_;
            auVar184._16_4_ = auVar20._16_4_ * auVar137._16_4_;
            auVar184._20_4_ = auVar20._20_4_ * auVar137._20_4_;
            auVar184._24_4_ = auVar20._24_4_ * auVar137._24_4_;
            auVar184._28_4_ = 0;
            auVar101 = vfmsub231ps_fma(auVar184,auVar18,auVar103);
            auVar58._4_4_ = auVar19._4_4_ * auVar103._4_4_;
            auVar58._0_4_ = auVar19._0_4_ * auVar103._0_4_;
            auVar58._8_4_ = auVar19._8_4_ * auVar103._8_4_;
            auVar58._12_4_ = auVar19._12_4_ * auVar103._12_4_;
            auVar58._16_4_ = auVar19._16_4_ * auVar103._16_4_;
            auVar58._20_4_ = auVar19._20_4_ * auVar103._20_4_;
            auVar58._24_4_ = auVar19._24_4_ * auVar103._24_4_;
            auVar58._28_4_ = auVar103._28_4_;
            auVar99 = vfmsub231ps_fma(auVar58,auVar191,auVar20);
            auVar59._4_4_ = auVar18._4_4_ * auVar191._4_4_;
            auVar59._0_4_ = auVar18._0_4_ * auVar191._0_4_;
            auVar59._8_4_ = auVar18._8_4_ * auVar191._8_4_;
            auVar59._12_4_ = auVar18._12_4_ * auVar191._12_4_;
            auVar59._16_4_ = auVar18._16_4_ * auVar191._16_4_;
            auVar59._20_4_ = auVar18._20_4_ * auVar191._20_4_;
            auVar59._24_4_ = auVar18._24_4_ * auVar191._24_4_;
            auVar59._28_4_ = auVar191._28_4_;
            auVar147 = vfmsub231ps_fma(auVar59,auVar19,auVar137);
            auVar101 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar101));
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT832(0) << 0x20,ZEXT1632(auVar99));
            auVar137 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar99));
            auVar137 = vcmpps_avx(auVar137,ZEXT832(0) << 0x20,2);
            auVar101 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
            auVar102 = vpand_avx(auVar101,auVar102);
            auVar137 = vpmovsxwd_avx2(auVar102);
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar137[0x1f]) {
LAB_016c945e:
              auVar210 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
              auVar102 = vpcmpeqd_avx(auVar98,auVar98);
              auVar144 = ZEXT1664(auVar102);
            }
            else {
              auVar60._4_4_ = auVar181._4_4_ * auVar20._4_4_;
              auVar60._0_4_ = auVar181._0_4_ * auVar20._0_4_;
              auVar60._8_4_ = auVar181._8_4_ * auVar20._8_4_;
              auVar60._12_4_ = auVar181._12_4_ * auVar20._12_4_;
              auVar60._16_4_ = auVar181._16_4_ * auVar20._16_4_;
              auVar60._20_4_ = auVar181._20_4_ * auVar20._20_4_;
              auVar60._24_4_ = auVar181._24_4_ * auVar20._24_4_;
              auVar60._28_4_ = auVar137._28_4_;
              auVar125 = vfmsub231ps_fma(auVar60,auVar19,auVar105);
              auVar192._0_4_ = auVar105._0_4_ * auVar18._0_4_;
              auVar192._4_4_ = auVar105._4_4_ * auVar18._4_4_;
              auVar192._8_4_ = auVar105._8_4_ * auVar18._8_4_;
              auVar192._12_4_ = auVar105._12_4_ * auVar18._12_4_;
              auVar192._16_4_ = auVar105._16_4_ * auVar18._16_4_;
              auVar192._20_4_ = auVar105._20_4_ * auVar18._20_4_;
              auVar192._24_4_ = auVar105._24_4_ * auVar18._24_4_;
              auVar192._28_4_ = 0;
              auVar147 = vfmsub231ps_fma(auVar192,auVar187,auVar20);
              auVar61._4_4_ = auVar187._4_4_ * auVar19._4_4_;
              auVar61._0_4_ = auVar187._0_4_ * auVar19._0_4_;
              auVar61._8_4_ = auVar187._8_4_ * auVar19._8_4_;
              auVar61._12_4_ = auVar187._12_4_ * auVar19._12_4_;
              auVar61._16_4_ = auVar187._16_4_ * auVar19._16_4_;
              auVar61._20_4_ = auVar187._20_4_ * auVar19._20_4_;
              auVar61._24_4_ = auVar187._24_4_ * auVar19._24_4_;
              auVar61._28_4_ = auVar19._28_4_;
              auVar97 = vfmsub231ps_fma(auVar61,auVar18,auVar181);
              auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar147),ZEXT1632(auVar97));
              auVar98 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar125),ZEXT832(0) << 0x20);
              auVar137 = vrcpps_avx(ZEXT1632(auVar98));
              auVar223._8_4_ = 0x3f800000;
              auVar223._0_8_ = &DAT_3f8000003f800000;
              auVar223._12_4_ = 0x3f800000;
              auVar223._16_4_ = 0x3f800000;
              auVar223._20_4_ = 0x3f800000;
              auVar223._24_4_ = 0x3f800000;
              auVar223._28_4_ = 0x3f800000;
              auVar224 = ZEXT3264(auVar223);
              auVar101 = vfnmadd213ps_fma(auVar137,ZEXT1632(auVar98),auVar223);
              auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar137,auVar137);
              auVar166._0_4_ = auVar97._0_4_ * auVar111._0_4_;
              auVar166._4_4_ = auVar97._4_4_ * auVar111._4_4_;
              auVar166._8_4_ = auVar97._8_4_ * auVar111._8_4_;
              auVar166._12_4_ = auVar97._12_4_ * auVar111._12_4_;
              auVar166._16_4_ = auVar111._16_4_ * 0.0;
              auVar166._20_4_ = auVar111._20_4_ * 0.0;
              auVar166._24_4_ = auVar111._24_4_ * 0.0;
              auVar166._28_4_ = 0;
              auVar147 = vfmadd231ps_fma(auVar166,ZEXT1632(auVar147),auVar206);
              auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar158,ZEXT1632(auVar125));
              fVar146 = auVar101._0_4_;
              fVar145 = auVar101._4_4_;
              fVar116 = auVar101._8_4_;
              fVar118 = auVar101._12_4_;
              auVar111 = ZEXT1632(CONCAT412(fVar118 * auVar147._12_4_,
                                            CONCAT48(fVar116 * auVar147._8_4_,
                                                     CONCAT44(fVar145 * auVar147._4_4_,
                                                              fVar146 * auVar147._0_4_))));
              uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar167._4_4_ = uVar94;
              auVar167._0_4_ = uVar94;
              auVar167._8_4_ = uVar94;
              auVar167._12_4_ = uVar94;
              auVar167._16_4_ = uVar94;
              auVar167._20_4_ = uVar94;
              auVar167._24_4_ = uVar94;
              auVar167._28_4_ = uVar94;
              auVar84._4_4_ = uStack_15c;
              auVar84._0_4_ = local_160;
              auVar84._8_4_ = uStack_158;
              auVar84._12_4_ = uStack_154;
              auVar84._16_4_ = uStack_150;
              auVar84._20_4_ = uStack_14c;
              auVar84._24_4_ = uStack_148;
              auVar84._28_4_ = uStack_144;
              auVar158 = vcmpps_avx(auVar84,auVar111,2);
              auVar206 = vcmpps_avx(auVar111,auVar167,2);
              auVar158 = vandps_avx(auVar206,auVar158);
              auVar101 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
              auVar102 = vpand_avx(auVar102,auVar101);
              auVar158 = vpmovsxwd_avx2(auVar102);
              if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar158 >> 0x7f,0) == '\0') &&
                    (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar158 >> 0xbf,0) == '\0') &&
                  (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar158[0x1f]) goto LAB_016c945e;
              auVar158 = vcmpps_avx(ZEXT1632(auVar98),ZEXT832(0) << 0x20,4);
              auVar98 = auVar158._16_16_;
              auVar101 = vpackssdw_avx(auVar158._0_16_,auVar98);
              auVar102 = vpand_avx(auVar102,auVar101);
              auVar158 = vpmovsxwd_avx2(auVar102);
              auVar210 = ZEXT3264(CONCAT824(uStack_548,
                                            CONCAT816(uStack_550,CONCAT88(uStack_558,local_560))));
              auVar102 = vpcmpeqd_avx(auVar98,auVar98);
              auVar144 = ZEXT1664(auVar102);
              if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar158 >> 0x7f,0) != '\0') ||
                    (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar158 >> 0xbf,0) != '\0') ||
                  (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar158[0x1f] < '\0') {
                auVar137 = ZEXT1632(CONCAT412(fVar118 * auVar17._12_4_,
                                              CONCAT48(fVar116 * auVar17._8_4_,
                                                       CONCAT44(fVar145 * auVar17._4_4_,
                                                                fVar146 * auVar17._0_4_))));
                auVar62._28_4_ = SUB84(uStack_548,4);
                auVar62._0_28_ =
                     ZEXT1628(CONCAT412(fVar118 * auVar99._12_4_,
                                        CONCAT48(fVar116 * auVar99._8_4_,
                                                 CONCAT44(fVar145 * auVar99._4_4_,
                                                          fVar146 * auVar99._0_4_))));
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = &DAT_3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar206 = vsubps_avx(auVar202,auVar137);
                local_120 = vblendvps_avx(auVar206,auVar137,auVar114);
                auVar206 = vsubps_avx(auVar202,auVar62);
                local_240 = vblendvps_avx(auVar206,auVar62,auVar114);
                auVar160 = ZEXT3264(local_240);
                auVar210 = ZEXT3264(auVar158);
                local_440 = auVar111;
              }
            }
            auVar231 = ZEXT3264(local_7a0);
            auVar219 = ZEXT3264(local_780);
            auVar215 = ZEXT3264(local_760);
            auVar158 = auVar210._0_32_;
            local_520 = auVar139;
            if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar158 >> 0x7f,0) == '\0') &&
                  (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar158 >> 0xbf,0) == '\0') &&
                (auVar210 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar210[0x1f]) goto LAB_016c90dc;
            auVar206 = vsubps_avx(auVar139,auVar104);
            auVar102 = vfmadd213ps_fma(auVar206,local_120,auVar104);
            fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar63._4_4_ = (auVar102._4_4_ + auVar102._4_4_) * fVar146;
            auVar63._0_4_ = (auVar102._0_4_ + auVar102._0_4_) * fVar146;
            auVar63._8_4_ = (auVar102._8_4_ + auVar102._8_4_) * fVar146;
            auVar63._12_4_ = (auVar102._12_4_ + auVar102._12_4_) * fVar146;
            auVar63._16_4_ = fVar146 * 0.0;
            auVar63._20_4_ = fVar146 * 0.0;
            auVar63._24_4_ = fVar146 * 0.0;
            auVar63._28_4_ = fVar146;
            auVar206 = vcmpps_avx(local_440,auVar63,6);
            auVar111 = auVar158 & auVar206;
            auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                          CONCAT424(fStack_6a8,
                                                    CONCAT420(fStack_6ac,
                                                              CONCAT416(fStack_6b0,
                                                                        CONCAT412(fStack_6b4,
                                                                                  CONCAT48(
                                                  fStack_6b8,CONCAT44(fStack_6bc,local_6c0))))))));
            auVar203 = ZEXT3264(local_6e0);
            auVar193 = ZEXT3264(local_6a0);
            if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar111 >> 0x7f,0) != '\0') ||
                  (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0xbf,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar111[0x1f] < '\0') {
              local_2c0 = vandps_avx(auVar206,auVar158);
              auVar140._8_4_ = 0xbf800000;
              auVar140._0_8_ = 0xbf800000bf800000;
              auVar140._12_4_ = 0xbf800000;
              auVar140._16_4_ = 0xbf800000;
              auVar140._20_4_ = 0xbf800000;
              auVar140._24_4_ = 0xbf800000;
              auVar140._28_4_ = 0xbf800000;
              auVar159._8_4_ = 0x40000000;
              auVar159._0_8_ = 0x4000000040000000;
              auVar159._12_4_ = 0x40000000;
              auVar159._16_4_ = 0x40000000;
              auVar159._20_4_ = 0x40000000;
              auVar159._24_4_ = 0x40000000;
              auVar159._28_4_ = 0x40000000;
              auVar160 = ZEXT3264(auVar159);
              auVar102 = vfmadd213ps_fma(local_240,auVar159,auVar140);
              local_380 = local_120;
              local_240 = ZEXT1632(auVar102);
              auVar158 = local_240;
              local_360 = ZEXT1632(auVar102);
              local_340 = local_440;
              local_31c = iVar12;
              local_310 = uVar74;
              uStack_308 = uVar75;
              local_300 = local_720;
              uStack_2f8 = uStack_718;
              local_2f0 = local_730;
              uStack_2e8 = uStack_728;
              local_2e0 = CONCAT44(fStack_73c,local_740);
              uStack_2d8 = CONCAT44(fStack_734,fStack_738);
              pGVar13 = (context->scene->geometries).items[uVar87].ptr;
              if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar146 = (float)local_320;
                local_2a0[0] = (fVar146 + local_120._0_4_ + 0.0) * local_180;
                local_2a0[1] = (fVar146 + local_120._4_4_ + 1.0) * fStack_17c;
                local_2a0[2] = (fVar146 + local_120._8_4_ + 2.0) * fStack_178;
                local_2a0[3] = (fVar146 + local_120._12_4_ + 3.0) * fStack_174;
                fStack_290 = (fVar146 + local_120._16_4_ + 4.0) * fStack_170;
                fStack_28c = (fVar146 + local_120._20_4_ + 5.0) * fStack_16c;
                fStack_288 = (fVar146 + local_120._24_4_ + 6.0) * fStack_168;
                fStack_284 = fVar146 + local_120._28_4_ + 7.0;
                local_240._0_8_ = auVar102._0_8_;
                local_240._8_8_ = auVar102._8_8_;
                local_280 = local_240._0_8_;
                uStack_278 = local_240._8_8_;
                uStack_270 = 0;
                uStack_268 = 0;
                local_260 = local_440;
                auVar141._8_4_ = 0x7f800000;
                auVar141._0_8_ = 0x7f8000007f800000;
                auVar141._12_4_ = 0x7f800000;
                auVar141._16_4_ = 0x7f800000;
                auVar141._20_4_ = 0x7f800000;
                auVar141._24_4_ = 0x7f800000;
                auVar141._28_4_ = 0x7f800000;
                auVar206 = vblendvps_avx(auVar141,local_440,local_2c0);
                auVar111 = vshufps_avx(auVar206,auVar206,0xb1);
                auVar111 = vminps_avx(auVar206,auVar111);
                auVar137 = vshufpd_avx(auVar111,auVar111,5);
                auVar111 = vminps_avx(auVar111,auVar137);
                auVar137 = vpermpd_avx2(auVar111,0x4e);
                auVar111 = vminps_avx(auVar111,auVar137);
                auVar111 = vcmpps_avx(auVar206,auVar111,0);
                auVar137 = local_2c0 & auVar111;
                auVar206 = local_2c0;
                if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar137 >> 0x7f,0) != '\0') ||
                      (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar137 >> 0xbf,0) != '\0') ||
                    (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar137[0x1f] < '\0') {
                  auVar206 = vandps_avx(auVar111,local_2c0);
                }
                uVar88 = vmovmskps_avx(auVar206);
                uVar90 = 0;
                for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                  uVar90 = uVar90 + 1;
                }
                uVar89 = (ulong)uVar90;
                local_240 = auVar158;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar146 = local_2a0[uVar89];
                  fVar145 = 1.0 - fVar146;
                  auVar101 = ZEXT416((uint)fVar146);
                  auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar101,
                                             ZEXT416(0xc0a00000));
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146 * 3.0)),
                                             ZEXT416((uint)(fVar146 + fVar146)),auVar205);
                  auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar101,
                                             ZEXT416(0x40000000));
                  auVar205 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145 * -3.0)),
                                             ZEXT416((uint)(fVar145 + fVar145)),auVar205);
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar146 * (fVar145 + fVar145))),
                                             ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),auVar101,
                                             ZEXT416((uint)(fVar145 * -2.0)));
                  fVar145 = auVar205._0_4_ * 0.5;
                  fVar116 = auVar101._0_4_ * 0.5;
                  auVar164._0_4_ = fVar116 * local_740;
                  auVar164._4_4_ = fVar116 * fStack_73c;
                  auVar164._8_4_ = fVar116 * fStack_738;
                  auVar164._12_4_ = fVar116 * fStack_734;
                  auVar128._4_4_ = fVar145;
                  auVar128._0_4_ = fVar145;
                  auVar128._8_4_ = fVar145;
                  auVar128._12_4_ = fVar145;
                  auVar82._8_8_ = uStack_728;
                  auVar82._0_8_ = local_730;
                  auVar205 = vfmadd132ps_fma(auVar128,auVar164,auVar82);
                  fVar145 = auVar102._0_4_ * 0.5;
                  auVar165._4_4_ = fVar145;
                  auVar165._0_4_ = fVar145;
                  auVar165._8_4_ = fVar145;
                  auVar165._12_4_ = fVar145;
                  auVar83._8_8_ = uStack_718;
                  auVar83._0_8_ = local_720;
                  auVar205 = vfmadd132ps_fma(auVar165,auVar205,auVar83);
                  uVar94 = *(undefined4 *)((long)&local_280 + uVar89 * 4);
                  fVar145 = auVar17._0_4_ * 0.5;
                  auVar149._4_4_ = fVar145;
                  auVar149._0_4_ = fVar145;
                  auVar149._8_4_ = fVar145;
                  auVar149._12_4_ = fVar145;
                  auVar205 = vfmadd132ps_fma(auVar149,auVar205,auVar15);
                  auVar160 = ZEXT1664(auVar205);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_260 + uVar89 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar205._0_4_;
                  uVar216 = vextractps_avx(auVar205,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar216;
                  uVar216 = vextractps_avx(auVar205,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar216;
                  *(float *)(ray + k * 4 + 0xf0) = fVar146;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar94;
                  *(uint *)(ray + k * 4 + 0x110) = uVar11;
                  *(uint *)(ray + k * 4 + 0x120) = uVar87;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_8a0 = ZEXT1632(CONCAT88(auVar205._8_8_,uVar89));
                  local_800._8_8_ = uStack_718;
                  local_800._0_8_ = local_720;
                  local_540._0_16_ = CONCAT88(uStack_728,local_730);
                  local_540 = ZEXT1632(local_540._0_16_);
                  auStack_5f0 = auVar9._16_16_;
                  uStack_5f8 = CONCAT44(fStack_734,fStack_738);
                  local_600 = (undefined1  [8])CONCAT44(fStack_73c,local_740);
                  local_620 = ZEXT1632(*local_668);
                  local_5a0 = local_2c0;
                  do {
                    auVar158 = local_8a0;
                    uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar146 = local_2a0[local_8a0._0_8_];
                    local_3e0._4_4_ = fVar146;
                    local_3e0._0_4_ = fVar146;
                    local_3e0._8_4_ = fVar146;
                    local_3e0._12_4_ = fVar146;
                    local_3d0 = *(undefined4 *)((long)&local_280 + local_8a0._0_8_ * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_260 + local_8a0._0_8_ * 4);
                    fVar145 = 1.0 - fVar146;
                    auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                               ZEXT416(0xc0a00000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146 * 3.0)),
                                               ZEXT416((uint)(fVar146 + fVar146)),auVar205);
                    auVar205 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                               ZEXT416(0x40000000));
                    auVar205 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145 * -3.0)),
                                               ZEXT416((uint)(fVar145 + fVar145)),auVar205);
                    auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar146 * (fVar145 + fVar145))),
                                               ZEXT416((uint)fVar145),ZEXT416((uint)fVar145));
                    auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar146 * fVar146)),local_3e0,
                                               ZEXT416((uint)(fVar145 * -2.0)));
                    fVar146 = auVar205._0_4_ * 0.5;
                    fVar145 = auVar101._0_4_ * 0.5;
                    auVar171._0_4_ = fVar145 * (float)local_600._0_4_;
                    auVar171._4_4_ = fVar145 * (float)local_600._4_4_;
                    auVar171._8_4_ = fVar145 * (float)uStack_5f8;
                    auVar171._12_4_ = fVar145 * uStack_5f8._4_4_;
                    auVar150._4_4_ = fVar146;
                    auVar150._0_4_ = fVar146;
                    auVar150._8_4_ = fVar146;
                    auVar150._12_4_ = fVar146;
                    auVar205 = vfmadd132ps_fma(auVar150,auVar171,local_540._0_16_);
                    fVar146 = auVar102._0_4_ * 0.5;
                    auVar172._4_4_ = fVar146;
                    auVar172._0_4_ = fVar146;
                    auVar172._8_4_ = fVar146;
                    auVar172._12_4_ = fVar146;
                    auVar205 = vfmadd132ps_fma(auVar172,auVar205,local_800);
                    local_710.context = context->user;
                    fVar146 = auVar17._0_4_ * 0.5;
                    auVar151._4_4_ = fVar146;
                    auVar151._0_4_ = fVar146;
                    auVar151._8_4_ = fVar146;
                    auVar151._12_4_ = fVar146;
                    auVar205 = vfmadd132ps_fma(auVar151,auVar205,auVar16);
                    local_410 = auVar205._0_4_;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = vshufps_avx(auVar205,auVar205,0x55);
                    local_3f0 = vshufps_avx(auVar205,auVar205,0xaa);
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = CONCAT44(uStack_1dc,local_1e0);
                    uStack_3b8 = CONCAT44(uStack_1d4,uStack_1d8);
                    local_3b0._4_4_ = uStack_1cc;
                    local_3b0._0_4_ = local_1d0;
                    local_3b0._8_4_ = uStack_1c8;
                    local_3b0._12_4_ = uStack_1c4;
                    vpcmpeqd_avx2(ZEXT1632(local_3b0),ZEXT1632(local_3b0));
                    uStack_39c = (local_710.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_710.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_7d0 = local_620._0_8_;
                    uStack_7c8 = local_620._8_8_;
                    local_710.valid = (int *)&local_7d0;
                    local_710.geometryUserPtr = pGVar13->userPtr;
                    local_710.hit = (RTCHitN *)&local_410;
                    local_710.N = 4;
                    local_710.ray = (RTCRayN *)ray;
                    if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar205 = auVar144._0_16_;
                      auVar224 = ZEXT1664(auVar224._0_16_);
                      (*pGVar13->intersectionFilterN)(&local_710);
                      auVar203 = ZEXT3264(local_6e0);
                      auVar231 = ZEXT3264(local_7a0);
                      auVar219 = ZEXT3264(local_780);
                      auVar215 = ZEXT3264(local_760);
                      auVar205 = vpcmpeqd_avx(auVar205,auVar205);
                      auVar144 = ZEXT1664(auVar205);
                      fVar227 = (float)local_7c0;
                      fVar232 = local_7c0._4_4_;
                      fVar115 = (float)uStack_7b8;
                      fVar117 = uStack_7b8._4_4_;
                      fVar119 = (float)uStack_7b0;
                      fVar238 = uStack_7b0._4_4_;
                      fVar239 = (float)uStack_7a8;
                    }
                    auVar76._8_8_ = uStack_7c8;
                    auVar76._0_8_ = local_7d0;
                    auVar205 = auVar144._0_16_;
                    if (auVar76 == (undefined1  [16])0x0) {
                      auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar205 = auVar205 ^ auVar102;
                      auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                                    CONCAT424(fStack_6a8,
                                                              CONCAT420(fStack_6ac,
                                                                        CONCAT416(fStack_6b0,
                                                                                  CONCAT412(
                                                  fStack_6b4,
                                                  CONCAT48(fStack_6b8,CONCAT44(fStack_6bc,local_6c0)
                                                          )))))));
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar224 = ZEXT1664(auVar224._0_16_);
                        (*p_Var14)(&local_710);
                        auVar203 = ZEXT3264(local_6e0);
                        auVar231 = ZEXT3264(local_7a0);
                        auVar219 = ZEXT3264(local_780);
                        auVar215 = ZEXT3264(local_760);
                        auVar205 = vpcmpeqd_avx(auVar205,auVar205);
                        auVar144 = ZEXT1664(auVar205);
                        fVar227 = (float)local_7c0;
                        fVar232 = local_7c0._4_4_;
                        fVar115 = (float)uStack_7b8;
                        fVar117 = uStack_7b8._4_4_;
                        fVar119 = (float)uStack_7b0;
                        fVar238 = uStack_7b0._4_4_;
                        fVar239 = (float)uStack_7a8;
                      }
                      auVar77._8_8_ = uStack_7c8;
                      auVar77._0_8_ = local_7d0;
                      auVar102 = vpcmpeqd_avx(auVar77,_DAT_01feba10);
                      auVar205 = auVar144._0_16_ ^ auVar102;
                      auVar197 = ZEXT3264(CONCAT428(fStack_6a4,
                                                    CONCAT424(fStack_6a8,
                                                              CONCAT420(fStack_6ac,
                                                                        CONCAT416(fStack_6b0,
                                                                                  CONCAT412(
                                                  fStack_6b4,
                                                  CONCAT48(fStack_6b8,CONCAT44(fStack_6bc,local_6c0)
                                                          )))))));
                      if (auVar77 != (undefined1  [16])0x0) {
                        auVar102 = auVar144._0_16_ ^ auVar102;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])local_710.hit);
                        *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x10));
                        *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x20));
                        *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x30));
                        *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x40));
                        *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x50));
                        *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x60));
                        *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar101;
                        auVar101 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x70));
                        *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar101;
                        auVar102 = vmaskmovps_avx(auVar102,*(undefined1 (*) [16])
                                                            (local_710.hit + 0x80));
                        *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar102;
                      }
                    }
                    auVar206 = local_440;
                    auVar129._8_8_ = 0x100000001;
                    auVar129._0_8_ = 0x100000001;
                    if ((auVar129 & auVar205) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar94;
                    }
                    *(undefined4 *)(local_5a0 + local_8a0._0_8_ * 4) = 0;
                    uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar113._4_4_ = uVar94;
                    auVar113._0_4_ = uVar94;
                    auVar113._8_4_ = uVar94;
                    auVar113._12_4_ = uVar94;
                    auVar113._16_4_ = uVar94;
                    auVar113._20_4_ = uVar94;
                    auVar113._24_4_ = uVar94;
                    auVar113._28_4_ = uVar94;
                    auVar137 = vcmpps_avx(auVar206,auVar113,2);
                    auVar111 = vandps_avx(auVar137,local_5a0);
                    auVar137 = local_5a0 & auVar137;
                    bVar70 = (auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar71 = (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar69 = (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar68 = SUB321(auVar137 >> 0x7f,0) != '\0';
                    bVar67 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar66 = SUB321(auVar137 >> 0xbf,0) != '\0';
                    bVar65 = (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar64 = auVar137[0x1f] < '\0';
                    if (((((((bVar70 || bVar71) || bVar69) || bVar68) || bVar67) || bVar66) ||
                        bVar65) || bVar64) {
                      auVar142._8_4_ = 0x7f800000;
                      auVar142._0_8_ = 0x7f8000007f800000;
                      auVar142._12_4_ = 0x7f800000;
                      auVar142._16_4_ = 0x7f800000;
                      auVar142._20_4_ = 0x7f800000;
                      auVar142._24_4_ = 0x7f800000;
                      auVar142._28_4_ = 0x7f800000;
                      auVar206 = vblendvps_avx(auVar142,auVar206,auVar111);
                      auVar137 = vshufps_avx(auVar206,auVar206,0xb1);
                      auVar137 = vminps_avx(auVar206,auVar137);
                      auVar191 = vshufpd_avx(auVar137,auVar137,5);
                      auVar137 = vminps_avx(auVar137,auVar191);
                      auVar191 = vpermpd_avx2(auVar137,0x4e);
                      local_5a0 = vminps_avx(auVar137,auVar191);
                      auVar137 = vcmpps_avx(auVar206,local_5a0,0);
                      auVar191 = auVar111 & auVar137;
                      auVar206 = auVar111;
                      if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar191 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar191 >> 0x7f,0) != '\0') ||
                            (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar191 >> 0xbf,0) != '\0') ||
                          (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar191[0x1f] < '\0') {
                        auVar206 = vandps_avx(auVar137,auVar111);
                      }
                      uVar90 = vmovmskps_avx(auVar206);
                      local_8a0._0_4_ = 0;
                      for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                        local_8a0._0_4_ = local_8a0._0_4_ + 1;
                      }
                      local_8a0._4_4_ = 0;
                      local_8a0._8_24_ = auVar158._8_24_;
                    }
                    auVar160 = ZEXT3264(local_5a0);
                    local_5a0 = auVar111;
                  } while (((((((bVar70 || bVar71) || bVar69) || bVar68) || bVar67) || bVar66) ||
                           bVar65) || bVar64);
                }
                auVar193 = ZEXT3264(local_6a0);
              }
            }
          }
          auVar144 = ZEXT3264(local_660);
          lVar93 = lVar93 + 8;
          auVar210 = ZEXT3264(local_5e0);
        } while ((int)lVar93 < iVar12);
      }
      uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar100._4_4_ = uVar94;
      auVar100._0_4_ = uVar94;
      auVar100._8_4_ = uVar94;
      auVar100._12_4_ = uVar94;
      auVar205 = vcmpps_avx(local_1c0,auVar100,2);
      uVar87 = vmovmskps_avx(auVar205);
      uVar87 = (uint)uVar92 & uVar87;
    } while (uVar87 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }